

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O2

void __thiscall Spaghetti<TTA>::FirstScan(Spaghetti<TTA> *this)

{
  long lVar1;
  char cVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined4 uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  uint v;
  uint uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long local_60;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar5 = *(uint *)&pMVar3->field_0x8;
  uVar30 = *(uint *)&pMVar3->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar5 & 0xfffffffe;
  this->o_rows = (uVar5 & 0x80000001) == 1;
  this->e_cols = uVar30 & 0xfffffffe;
  this->o_cols = (uVar30 & 0x80000001) == 1;
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  lVar39 = *(long *)&pMVar3->field_0x10;
  if (uVar5 == 1) {
    lVar36 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar29 = (long)(int)uVar30 + -2;
    uVar8 = 0xfffffffffffffffe;
LAB_00178b49:
    do {
      lVar19 = (long)(int)uVar8;
      uVar8 = lVar19 + 2;
      iVar28 = (int)lVar29;
      if (iVar28 <= (int)uVar8) {
        if (iVar28 < (int)uVar8) {
          if (*(char *)(lVar39 + uVar8) == '\0') {
LAB_00178ee0:
            *(undefined4 *)(lVar36 + 8 + lVar19 * 4) = 0;
            return;
          }
        }
        else if (*(char *)(lVar39 + uVar8) == '\0') {
LAB_00178fa2:
          if (*(char *)(lVar39 + 1 + uVar8) != '\0') {
            uVar5 = TTA::NewLabel();
            *(uint *)(lVar36 + uVar8 * 4) = uVar5;
            return;
          }
          *(undefined4 *)(lVar36 + uVar8 * 4) = 0;
          return;
        }
LAB_00178f3b:
        uVar5 = TTA::NewLabel();
LAB_00178f40:
        *(uint *)(lVar36 + 8 + lVar19 * 4) = uVar5;
        return;
      }
      if (*(char *)(lVar39 + uVar8) == '\0') goto LAB_00178b7d;
      cVar2 = *(char *)(lVar39 + 3 + lVar19);
      uVar5 = TTA::NewLabel();
      *(uint *)(lVar36 + 8 + lVar19 * 4) = uVar5;
      uVar9 = uVar8;
    } while (cVar2 == '\0');
    do {
      uVar37 = uVar9 + 2;
      if (lVar29 <= (long)uVar37) {
        uVar8 = (ulong)(int)uVar37;
        if (iVar28 < (int)uVar37) {
          if (*(char *)(lVar39 + uVar8) == '\0') {
LAB_0017c653:
            *(undefined4 *)(lVar36 + uVar8 * 4) = 0;
            return;
          }
        }
        else if (*(char *)(lVar39 + uVar8) == '\0') goto LAB_00178fa2;
        uVar11 = *(undefined4 *)(lVar36 + (long)(int)uVar9 * 4);
LAB_0017c64a:
        *(undefined4 *)(lVar36 + uVar8 * 4) = uVar11;
        return;
      }
      if (*(char *)(lVar39 + uVar37) == '\0') {
        uVar8 = uVar37 & 0xffffffff;
LAB_00178b7d:
        uVar37 = (ulong)(int)uVar8;
        if (*(char *)(lVar39 + 1 + uVar37) == '\0') {
          uVar11 = 0;
          goto LAB_00178bc9;
        }
        uVar5 = TTA::NewLabel();
      }
      else {
        if (*(char *)(lVar39 + 3 + uVar9) == '\0') goto LAB_00178bc2;
        uVar5 = *(uint *)(lVar36 + uVar9 * 4);
      }
      *(uint *)(lVar36 + uVar37 * 4) = uVar5;
      uVar9 = uVar37;
    } while( true );
  }
  uVar8 = 0xfffffffffffffffe;
  lVar43 = lVar39 + **(long **)&pMVar3->field_0x48;
  lVar26 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar29 = (long)(int)uVar30 + -2;
  lVar36 = lVar39 + 2 + **(long **)&pMVar3->field_0x48;
  while( true ) {
    lVar20 = (long)(int)uVar8;
    uVar8 = lVar20 + 2;
    iVar28 = (int)lVar29;
    if (iVar28 <= (int)uVar8) break;
    if (*(char *)(lVar39 + uVar8) == '\0') {
      uVar9 = uVar8 & 0xffffffff;
      if (*(char *)(lVar43 + uVar8) == '\0') goto LAB_00178c5f;
    }
    else {
      uVar9 = uVar8 & 0xffffffff;
    }
LAB_00178e10:
    cVar2 = *(char *)(lVar39 + 1 + uVar8);
    uVar6 = TTA::NewLabel();
    *(uint *)(lVar26 + uVar8 * 4) = uVar6;
    uVar8 = uVar9;
    if (cVar2 != '\0') goto LAB_00178c93;
LAB_00178cce:
    iVar41 = (int)uVar9;
    lVar12 = (long)iVar41;
    lVar20 = lVar26 + lVar12 * 4;
    lVar21 = lVar36 + lVar12;
    lVar38 = lVar12 << 0x20;
    lVar1 = lVar39 + 2 + lVar12;
    lVar19 = 0;
    while( true ) {
      lVar13 = lVar38 >> 0x20;
      if (lVar29 <= lVar12 + 2 + lVar19) {
        uVar9 = (ulong)(iVar41 + 2) + lVar19;
        uVar8 = lVar38 + 0x200000000 >> 0x20;
        if (iVar28 < (int)uVar9) {
          if ((*(char *)(lVar39 + uVar8) == '\0') && (*(char *)(lVar43 + uVar8) == '\0')) {
            *(undefined4 *)(lVar26 + uVar8 * 4) = 0;
            goto LAB_00178fda;
          }
        }
        else {
          if (*(char *)(lVar39 + uVar8) != '\0') {
            if (*(char *)(lVar43 + 1 + lVar13) != '\0') goto LAB_00178fd1;
            goto LAB_00178f19;
          }
          if (*(char *)(lVar43 + uVar8) == '\0') {
            uVar8 = uVar9 & 0xffffffff;
            goto LAB_0017c76a;
          }
        }
        if (*(char *)(lVar43 + 1 + lVar13) == '\0') {
          uVar6 = TTA::NewLabel();
        }
        else {
          uVar6 = *(uint *)(lVar26 + lVar13 * 4);
        }
        *(uint *)(lVar26 + (lVar38 + 0x200000000 >> 0x1e)) = uVar6;
        goto LAB_00178fda;
      }
      if (*(char *)(lVar1 + lVar19) != '\0') {
        uVar9 = (ulong)(iVar41 + 2) + lVar19;
        if (*(char *)(lVar43 + 1 + lVar13) != '\0') {
          uVar8 = uVar9 & 0xffffffff;
          goto LAB_00178cb6;
        }
        uVar8 = lVar38 + 0x200000000 >> 0x20;
        goto LAB_00178e10;
      }
      if (*(char *)(lVar21 + lVar19) == '\0') {
        uVar8 = (ulong)(iVar41 + (int)lVar19 + 2);
        goto LAB_00178c5f;
      }
      if (*(char *)(lVar1 + 1 + lVar19) != '\0') break;
      if (*(char *)(lVar21 + -1 + lVar19) == '\0') {
        uVar6 = TTA::NewLabel();
      }
      else {
        uVar6 = *(uint *)(lVar20 + lVar19 * 4);
      }
      *(uint *)(lVar20 + 8 + lVar19 * 4) = uVar6;
      lVar19 = lVar19 + 2;
      lVar38 = lVar38 + 0x200000000;
    }
    uVar8 = (ulong)(iVar41 + 2) + lVar19;
    lVar21 = lVar12 + 2 + lVar19;
    if (*(char *)(lVar36 + -1 + lVar12 + lVar19) == '\0') {
      uVar6 = TTA::NewLabel();
    }
    else {
      uVar6 = *(uint *)(lVar20 + lVar19 * 4);
    }
    while( true ) {
      *(uint *)(lVar26 + lVar21 * 4) = uVar6;
LAB_00178c93:
      while( true ) {
        lVar20 = (long)(int)uVar8;
        uVar8 = lVar20 + 2;
        if (iVar28 <= (int)uVar8) {
          if ((int)uVar8 <= iVar28) {
            if ((*(char *)(lVar39 + uVar8) != '\0') || (*(char *)(lVar43 + uVar8) != '\0'))
            goto LAB_00178fd1;
            goto LAB_0017c76a;
          }
          if ((*(char *)(lVar39 + uVar8) == '\0') && (*(char *)(lVar43 + uVar8) == '\0')) {
            *(undefined4 *)(lVar26 + 8 + lVar20 * 4) = 0;
          }
          else {
            *(undefined4 *)(lVar26 + 8 + lVar20 * 4) = *(undefined4 *)(lVar26 + lVar20 * 4);
          }
          goto LAB_00178fda;
        }
        if ((*(char *)(lVar39 + uVar8) == '\0') && (*(char *)(lVar43 + uVar8) == '\0')) break;
LAB_00178cb6:
        lVar20 = (long)(int)uVar8;
        cVar2 = *(char *)(lVar39 + 1 + lVar20);
        *(undefined4 *)(lVar26 + lVar20 * 4) = *(undefined4 *)(lVar26 + -8 + lVar20 * 4);
        uVar9 = uVar8;
        if (cVar2 == '\0') goto LAB_00178cce;
      }
LAB_00178c5f:
      lVar21 = (long)(int)uVar8;
      if ((*(char *)(lVar21 + 1 + lVar39) == '\0') && (*(char *)(lVar43 + 1 + lVar21) == '\0'))
      break;
      uVar6 = TTA::NewLabel();
    }
    *(undefined4 *)(lVar26 + (long)(int)uVar8 * 4) = 0;
  }
  if (iVar28 < (int)uVar8) {
    if ((*(char *)(lVar39 + uVar8) == '\0') && (*(char *)(lVar43 + uVar8) == '\0')) {
      *(undefined4 *)(lVar26 + 8 + lVar20 * 4) = 0;
    }
    else {
      uVar6 = TTA::NewLabel();
      *(uint *)(lVar26 + 8 + lVar20 * 4) = uVar6;
    }
    goto LAB_00178fda;
  }
  if ((*(char *)(lVar39 + uVar8) == '\0') && (*(char *)(lVar43 + uVar8) == '\0')) {
LAB_0017c76a:
    lVar36 = (long)(int)uVar8;
    if ((*(char *)(lVar36 + 1 + lVar39) == '\0') && (*(char *)(lVar43 + 1 + lVar36) == '\0')) {
      *(undefined4 *)(lVar26 + lVar36 * 4) = 0;
    }
    else {
      uVar6 = TTA::NewLabel();
      *(uint *)(lVar26 + lVar36 * 4) = uVar6;
    }
    goto LAB_00178fda;
  }
LAB_00178f19:
  uVar6 = TTA::NewLabel();
LAB_00178fd6:
  *(uint *)(lVar26 + uVar8 * 4) = uVar6;
LAB_00178fda:
  lVar39 = 2;
  lVar43 = 1;
  local_60 = 3;
  lVar36 = 0;
  do {
    if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 <= lVar39) {
      if (this->o_rows == false) {
        return;
      }
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar38 = *(long *)&pMVar3->field_0x10;
      lVar12 = **(long **)&pMVar3->field_0x48;
      lVar19 = (long)(int)(uVar5 - 1);
      lVar43 = lVar38 + lVar12 * lVar19;
      lVar13 = lVar43 - lVar12;
      lVar22 = lVar13 - lVar12;
      lVar20 = *(long *)&pMVar4->field_0x10;
      lVar21 = **(long **)&pMVar4->field_0x48;
      lVar36 = lVar20 + lVar21 * lVar19;
      lVar14 = lVar36 + lVar21 * -2;
      lVar39 = lVar13 + 1;
      lVar31 = (lVar19 + -1) * lVar12;
      lVar26 = lVar14 + 8;
      lVar18 = lVar21 * (lVar19 + -2) + lVar20 + 0x10;
      lVar20 = lVar20 + 8 + lVar21 * lVar19;
      lVar21 = lVar31 + 4 + lVar38;
      lVar1 = lVar38 + 3 + lVar12 * lVar19;
      lVar12 = (lVar19 + -2) * lVar12 + 3 + lVar38;
      uVar8 = 0xfffffffffffffffe;
LAB_0017bc4b:
      lVar19 = (long)(int)uVar8;
      uVar9 = lVar19 + 2;
      uVar8 = uVar9;
      if ((int)uVar9 < iVar28) {
        if (*(char *)(lVar43 + uVar9) == '\0') goto LAB_0017bc95;
        if (*(char *)(lVar19 + 3 + lVar13) != '\0') goto LAB_0017bdbd;
        if (*(char *)(lVar43 + 3 + lVar19) != '\0') {
LAB_0017bcb0:
          uVar37 = (ulong)(int)uVar9;
          if (*(char *)(lVar13 + 2 + uVar37) == '\0') {
            if (*(char *)(lVar13 + uVar37) != '\0') goto LAB_0017bcf0;
            goto LAB_0017bf5a;
          }
          uVar8 = uVar9;
          if (*(char *)(lVar13 + uVar37) == '\0') goto LAB_0017bf4f;
LAB_0017bcc8:
          lVar19 = (long)(int)uVar9;
          uVar8 = uVar9;
          if (*(char *)(lVar22 + 1 + lVar19) == '\0') {
            uVar5 = *(uint *)(lVar14 + lVar19 * 4);
            uVar30 = *(uint *)(lVar14 + 8 + lVar19 * 4);
            goto LAB_0017bd79;
          }
          uVar5 = *(uint *)(lVar26 + lVar19 * 4);
LAB_0017bd82:
          *(uint *)(lVar36 + lVar19 * 4) = uVar5;
LAB_0017bf68:
          iVar41 = (int)uVar8;
          lVar27 = (long)iVar41;
          lVar15 = lVar27 << 0x20;
          lVar19 = lVar21 + lVar27;
          lVar33 = lVar18 + lVar27 * 4;
          lVar16 = lVar20 + lVar27 * 4;
          lVar10 = 0;
          while( true ) {
            uVar37 = lVar27 + lVar10 + 2;
            lVar32 = lVar15 >> 0x20;
            if (lVar29 <= (long)uVar37) break;
            if (*(char *)(lVar1 + lVar27 + -1 + lVar10) == '\0') {
              uVar9 = (ulong)(iVar41 + 2) + lVar10;
              iVar41 = (int)uVar9;
              lVar19 = lVar15 + 0x300000000 >> 0x20;
              if (*(char *)(lVar43 + lVar19) == '\0') goto LAB_0017bd8e;
              if (*(char *)(lVar13 + lVar19) != '\0') goto LAB_0017bf17;
              if (*(char *)(lVar13 + 4 + lVar32) == '\0') goto LAB_0017bcf0;
              goto LAB_0017bcc8;
            }
            iVar40 = (int)lVar10;
            if (*(char *)(lVar19 + -1 + lVar10) != '\0') {
              uVar8 = (ulong)(iVar41 + iVar40 + 2);
              *(undefined4 *)(lVar16 + lVar10 * 4) = *(undefined4 *)(lVar33 + -8 + lVar10 * 4);
              goto LAB_0017c338;
            }
            if (*(char *)(lVar1 + lVar27 + lVar10) == '\0') {
              uVar8 = (ulong)(iVar41 + iVar40 + 2);
              *(undefined4 *)(lVar16 + lVar10 * 4) = *(undefined4 *)(lVar36 + (lVar15 >> 0x1e));
              goto LAB_0017bc4b;
            }
            if (*(char *)(lVar19 + lVar10) == '\0') goto LAB_0017c0d8;
            uVar5 = *(uint *)(lVar33 + lVar10 * 4);
            if (*(char *)(lVar12 + lVar27 + lVar10) == '\0') {
              uVar5 = TTA::Merge(uVar5,*(uint *)(lVar16 + -8 + lVar10 * 4));
            }
            *(uint *)(lVar16 + lVar10 * 4) = uVar5;
            lVar15 = lVar15 + 0x200000000;
            lVar10 = lVar10 + 2;
          }
          uVar8 = (ulong)(iVar41 + 2) + lVar10;
          if ((int)uVar8 <= iVar28) {
            lVar39 = lVar15 + 0x200000000 >> 0x20;
            if (*(char *)(lVar43 + lVar39) == '\0') {
              if (*(char *)(lVar43 + 3 + lVar32) == '\0') {
                *(undefined4 *)(lVar36 + lVar39 * 4) = 0;
                return;
              }
            }
            else if (*(char *)(lVar13 + 3 + lVar32) == '\0') {
              uVar11 = *(undefined4 *)(lVar36 + lVar32 * 4);
              goto LAB_0017c830;
            }
            uVar11 = *(undefined4 *)(lVar14 + lVar39 * 4);
LAB_0017c830:
            *(undefined4 *)(lVar36 + lVar39 * 4) = uVar11;
            return;
          }
LAB_0017c637:
          uVar8 = (ulong)(int)uVar8;
          if (*(char *)(lVar43 + uVar8) == '\0') goto LAB_0017c653;
          uVar11 = *(undefined4 *)(lVar36 + -8 + uVar8 * 4);
          goto LAB_0017c64a;
        }
        if (*(char *)(lVar13 + uVar9) == '\0') {
LAB_0017bc85:
          uVar5 = TTA::NewLabel();
          *(uint *)(lVar36 + 8 + lVar19 * 4) = uVar5;
          uVar8 = uVar9;
        }
        else {
LAB_0017be15:
          *(undefined4 *)(lVar36 + 8 + lVar19 * 4) = *(undefined4 *)(lVar14 + 8 + lVar19 * 4);
          uVar8 = uVar9;
        }
        goto LAB_0017bc4b;
      }
      if (iVar28 < (int)uVar9) {
        if (*(char *)(lVar43 + uVar9) == '\0') goto LAB_00178ee0;
LAB_0017c8e6:
        if (*(char *)(lVar13 + uVar8) == '\0') {
          uVar5 = TTA::NewLabel();
          goto LAB_0017ca27;
        }
      }
      else {
        if (*(char *)(lVar43 + uVar9) == '\0') {
LAB_0017c802:
          if (*(char *)(lVar43 + 1 + uVar8) == '\0') {
LAB_0017c80e:
            *(undefined4 *)(lVar36 + uVar8 * 4) = 0;
            return;
          }
        }
        if (*(char *)(lVar13 + 1 + uVar8) == '\0') goto LAB_0017c8e6;
      }
LAB_0017c963:
      uVar5 = *(uint *)(lVar14 + uVar8 * 4);
LAB_0017ca27:
      *(uint *)(lVar36 + uVar8 * 4) = uVar5;
      return;
    }
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar1 = *(long *)&pMVar3->field_0x10;
    lVar12 = **(long **)&pMVar3->field_0x48;
    lVar22 = lVar12 * lVar39;
    lVar26 = lVar1 + lVar22;
    lVar31 = lVar26 - lVar12;
    lVar20 = lVar12 + lVar26;
    lVar38 = *(long *)&pMVar4->field_0x10;
    lVar19 = **(long **)&pMVar4->field_0x48;
    lVar13 = lVar19 * lVar39;
    lVar21 = lVar38 + lVar13;
    lVar18 = lVar21 + lVar19 * -2;
    cVar2 = *(char *)(lVar1 + lVar22);
    if (2 < (int)uVar30) {
      lVar14 = lVar31 - lVar12;
      uVar8 = 0;
      uVar9 = 0;
      if (cVar2 == '\0') goto LAB_001791ba;
LAB_001790f3:
      lVar33 = (long)(int)uVar9;
      if (*(char *)(lVar33 + 1 + lVar31) == '\0') {
        if (*(char *)(lVar26 + 1 + lVar33) != '\0') goto LAB_00179261;
        if (*(char *)(lVar31 + lVar33) == '\0') {
          uVar6 = TTA::NewLabel();
          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
          goto LAB_001795ed;
        }
        *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
        goto LAB_00179cf3;
      }
      *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
LAB_0017b26f:
      iVar41 = (int)uVar9;
      lVar32 = (long)iVar41;
      lVar42 = lVar32 << 0x20;
      lVar33 = lVar1 + lVar22 + lVar32;
      lVar15 = lVar12 * lVar43 + lVar32;
      lVar35 = lVar12 * local_60 + lVar32;
      lVar16 = lVar13 + lVar32 * 4;
      lVar10 = lVar38 + lVar16 + 8;
      lVar27 = lVar19 * lVar36 + lVar32 * 4;
      lVar34 = lVar38 + lVar27 + 8;
      lVar44 = 0;
      do {
        uVar8 = lVar32 + lVar44 + 2;
        lVar25 = lVar42 >> 0x1e;
        lVar24 = lVar42 >> 0x20;
        iVar40 = (int)lVar44;
        if (lVar29 <= (long)uVar8) {
          uVar37 = (ulong)(iVar41 + 2) + lVar44;
          uVar9 = uVar8 & 0xffffffff;
          iVar17 = (int)uVar37;
          if (iVar17 <= iVar28) {
            if (*(char *)(lVar26 + uVar9) != '\0') {
              uVar8 = (ulong)(iVar40 + iVar41 + 1);
              if ((*(char *)(lVar26 + uVar8) != '\0') || (*(char *)(lVar20 + uVar8) != '\0'))
              goto LAB_0017b851;
              if (*(char *)(lVar31 + 3 + lVar24) != '\0') {
                if (*(char *)(lVar31 + uVar9) == '\0') {
                  lVar26 = lVar42 + 0x200000000 >> 0x20;
LAB_001799b2:
                  if (*(char *)(lVar14 + lVar26) == '\0') {
                    uVar6 = *(uint *)(lVar18 + -8 + lVar26 * 4);
                    uVar7 = *(uint *)(lVar18 + lVar26 * 4);
                    goto LAB_0017b895;
                  }
                  goto LAB_0017b863;
                }
                goto LAB_001790a2;
              }
LAB_0017ba12:
              if (*(char *)(lVar31 + uVar9) != '\0') goto LAB_001790a2;
              uVar11 = *(undefined4 *)(lVar18 + lVar25);
              goto LAB_001790a5;
            }
            if (*(char *)(lVar20 + uVar9) == '\0') goto LAB_0017b93f;
            uVar23 = (ulong)(iVar40 + iVar41 + 3);
            if (*(char *)(lVar26 + uVar23) == '\0') goto LAB_0017b714;
            uVar8 = (ulong)(iVar40 + iVar41 + 1);
            if (*(char *)(lVar26 + uVar8) != '\0') goto LAB_0017b851;
            if (*(char *)(lVar20 + uVar8) == '\0') goto LAB_00179091;
            if (*(char *)(lVar31 + uVar23) != '\0') {
              lVar26 = lVar42 + 0x200000000 >> 0x20;
              goto LAB_0017b85c;
            }
            if (*(char *)(lVar31 + uVar9) == '\0') goto LAB_0017b82d;
            goto LAB_001790a2;
          }
          if (*(char *)(lVar26 + uVar9) == '\0') {
            if (*(char *)(lVar20 + uVar9) == '\0') {
              *(undefined4 *)(lVar21 + uVar9 * 4) = 0;
            }
            else {
LAB_0017b714:
              uVar9 = (ulong)(iVar40 + iVar41 + 1);
              if (*(char *)(lVar20 + uVar9) == '\0') {
                if (*(char *)(lVar26 + uVar9) == '\0') {
                  uVar6 = TTA::NewLabel();
                  *(uint *)(lVar21 + (uVar8 & 0xffffffff) * 4) = uVar6;
                }
                else {
                  *(undefined4 *)(lVar21 + (uVar8 & 0xffffffff) * 4) =
                       *(undefined4 *)(lVar21 + lVar25);
                }
              }
              else {
                *(undefined4 *)(lVar21 + (uVar8 & 0xffffffff) * 4) =
                     *(undefined4 *)(lVar21 + lVar25);
              }
            }
            goto LAB_0017b97f;
          }
          uVar8 = (ulong)(iVar40 + iVar41 + 1);
          if (*(char *)(lVar26 + uVar8) != '\0') {
            *(undefined4 *)(lVar21 + uVar9 * 4) = *(undefined4 *)(lVar21 + lVar25);
            goto LAB_0017b97f;
          }
          if (*(char *)(lVar20 + uVar8) == '\0') goto LAB_0017ba12;
LAB_0017b82d:
          uVar11 = *(undefined4 *)(lVar21 + lVar25);
          goto LAB_001790a5;
        }
        if (*(char *)(lVar33 + 2 + lVar44) == '\0') {
          uVar9 = (ulong)(iVar41 + 2) + lVar44;
          if (*(char *)(lVar44 + 2 + lVar35 + lVar1) == '\0') {
            uVar8 = uVar9 & 0xffffffff;
            goto LAB_00179229;
          }
          lVar33 = lVar42 + 0x300000000 >> 0x20;
          lVar32 = lVar42 + 0x100000000 >> 0x20;
          if (*(char *)(lVar26 + lVar33) == '\0') {
            if (*(char *)(lVar20 + lVar32) != '\0') {
              *(undefined4 *)(lVar16 + lVar38 + 8 + lVar44 * 4) = *(undefined4 *)(lVar21 + lVar25);
              uVar37 = uVar9 & 0xffffffff;
              goto LAB_0017984a;
            }
            if (*(char *)(lVar26 + lVar32) == '\0') {
              uVar6 = TTA::NewLabel();
            }
            else {
              uVar6 = *(uint *)(lVar21 + lVar25);
            }
            *(uint *)(lVar16 + lVar38 + 8 + lVar44 * 4) = uVar6;
            uVar37 = uVar9 & 0xffffffff;
            goto LAB_0017984a;
          }
          if (*(char *)(lVar26 + lVar32) != '\0') {
            uVar37 = lVar42 + 0x200000000 >> 0x20;
            goto LAB_0017b475;
          }
          if (*(char *)(lVar20 + lVar32) == '\0') goto LAB_0017923b;
          if (*(char *)(lVar31 + lVar33) != '\0') goto LAB_0017b484;
          if (*(char *)(lVar31 + 4 + lVar24) == '\0') {
            if (*(char *)(lVar44 + 2 + lVar15 + lVar1) == '\0') {
              *(undefined4 *)(lVar10 + lVar44 * 4) = *(undefined4 *)(lVar21 + lVar24 * 4);
              uVar8 = uVar9 & 0xffffffff;
              goto LAB_00179e1b;
            }
            *(undefined4 *)(lVar10 + lVar44 * 4) = *(undefined4 *)(lVar27 + lVar38 + 8 + lVar44 * 4)
            ;
            uVar8 = uVar9 & 0xffffffff;
            goto LAB_0017a371;
          }
          uVar37 = lVar42 + 0x200000000 >> 0x20;
          uVar8 = uVar9 & 0xffffffff;
          goto LAB_0017ac35;
        }
        if ((*(char *)(lVar33 + 1 + lVar44) != '\0') ||
           (*(char *)(lVar1 + lVar35 + 1 + lVar44) != '\0')) {
          uVar8 = (ulong)(iVar40 + iVar41 + 2);
          goto LAB_0017abf9;
        }
        if (*(char *)(lVar1 + lVar15 + 3 + lVar44) == '\0') {
          uVar9 = (ulong)(iVar41 + 2) + lVar44;
          if (*(char *)(lVar44 + 3 + lVar22 + lVar32 + lVar1) == '\0') {
            if (*(char *)(lVar44 + 2 + lVar15 + lVar1) == '\0') {
              *(undefined4 *)(lVar16 + lVar38 + 8 + lVar44 * 4) = *(undefined4 *)(lVar18 + lVar25);
              goto LAB_001795ed;
            }
            *(undefined4 *)(lVar10 + lVar44 * 4) = *(undefined4 *)(lVar34 + lVar44 * 4);
            goto LAB_00179cf3;
          }
          cVar2 = *(char *)(lVar44 + 2 + lVar15 + lVar1);
          if (*(char *)(lVar31 + 4 + lVar24) == '\0') {
            if (cVar2 == '\0') {
              *(undefined4 *)(lVar10 + lVar44 * 4) = *(undefined4 *)(lVar18 + lVar24 * 4);
              uVar8 = uVar9 & 0xffffffff;
              goto LAB_00179e1b;
            }
            *(undefined4 *)(lVar10 + lVar44 * 4) = *(undefined4 *)(lVar27 + lVar38 + 8 + lVar44 * 4)
            ;
            uVar8 = uVar9 & 0xffffffff;
            goto LAB_0017a371;
          }
          if (cVar2 == '\0') {
            uVar37 = lVar42 + 0x200000000 >> 0x20;
            uVar8 = uVar9 & 0xffffffff;
            goto LAB_0017b79b;
          }
          uVar8 = uVar9 & 0xffffffff;
LAB_00179272:
          lVar33 = (long)(int)uVar8;
          if (*(char *)(lVar14 + 1 + lVar33) == '\0') {
            uVar6 = TTA::Merge(*(uint *)(lVar18 + lVar33 * 4),*(uint *)(lVar18 + 8 + lVar33 * 4));
            goto LAB_001792c0;
          }
LAB_00179281:
          uVar6 = *(uint *)(lVar18 + 8 + lVar33 * 4);
LAB_001792c0:
          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
LAB_00179fd5:
          iVar41 = (int)uVar8;
          lVar44 = (long)iVar41;
          lVar32 = lVar44 << 0x20;
          lVar33 = lVar13 + lVar44 * 4;
          lVar34 = lVar33 + lVar38 + 8;
          lVar16 = lVar1 + lVar12 * lVar43 + lVar44;
          lVar10 = lVar19 * lVar36 + lVar44 * 4 + lVar38;
          lVar15 = lVar10 + 8;
          lVar27 = lVar1 + lVar22 + lVar44;
          lVar42 = lVar27 + 3;
          lVar35 = 0;
LAB_0017a088:
          uVar8 = lVar44 + lVar35 + 2;
          lVar24 = lVar32 >> 0x20;
          if ((long)uVar8 < lVar29) {
            iVar40 = (int)lVar35;
            lVar25 = lVar32 >> 0x1e;
            if (*(char *)(lVar27 + 2 + lVar35) == '\0') {
              if (*(char *)(lVar12 * local_60 + lVar44 + lVar1 + 2 + lVar35) == '\0') {
                uVar8 = (ulong)(iVar41 + 2) + lVar35;
                lVar33 = lVar32 + 0x300000000 >> 0x20;
                if (*(char *)(lVar26 + lVar33) == '\0') goto LAB_001792ef;
                if (*(char *)(lVar31 + lVar33) != '\0') {
                  *(undefined4 *)(lVar34 + lVar35 * 4) = *(undefined4 *)(lVar15 + lVar35 * 4);
                  uVar9 = uVar8 & 0xffffffff;
                  goto LAB_0017ab1b;
                }
                if (*(char *)(lVar31 + 4 + lVar24) == '\0') {
                  *(undefined4 *)(lVar34 + lVar35 * 4) = *(undefined4 *)(lVar15 + lVar35 * 4);
                  goto LAB_0017a371;
                }
                goto LAB_00179272;
              }
              if (*(char *)(lVar42 + lVar35) == '\0') {
                uVar37 = (ulong)(iVar41 + iVar40 + 2);
                *(undefined4 *)(lVar33 + lVar38 + 8 + lVar35 * 4) = *(undefined4 *)(lVar21 + lVar25)
                ;
                goto LAB_0017984a;
              }
              if (*(char *)(lVar16 + 3 + lVar35) != '\0') {
                uVar9 = (ulong)(iVar41 + iVar40 + 2);
                *(undefined4 *)(lVar34 + lVar35 * 4) = *(undefined4 *)(lVar15 + lVar35 * 4);
                goto LAB_0017ab1b;
              }
LAB_0017a0e3:
              if (*(char *)(lVar16 + 4 + lVar35) == '\0') {
                uVar8 = (ulong)(iVar41 + iVar40 + 2);
                *(undefined4 *)(lVar33 + lVar38 + 8 + lVar35 * 4) = *(undefined4 *)(lVar21 + lVar25)
                ;
                goto LAB_0017a579;
              }
              uVar6 = *(uint *)(lVar10 + 0x10 + lVar35 * 4);
              if (*(char *)(lVar12 * lVar36 + lVar44 + lVar1 + 3 + lVar35) == '\0') {
                uVar6 = TTA::Merge(uVar6,*(uint *)(lVar33 + lVar38 + lVar35 * 4));
              }
              *(uint *)(lVar34 + lVar35 * 4) = uVar6;
              lVar32 = lVar32 + 0x200000000;
              lVar35 = lVar35 + 2;
              goto LAB_0017a088;
            }
            if (*(char *)(lVar16 + 3 + lVar35) != '\0') {
              uVar9 = (ulong)(iVar41 + iVar40 + 2);
              *(undefined4 *)(lVar34 + lVar35 * 4) = *(undefined4 *)(lVar15 + lVar35 * 4);
              goto LAB_0017b26f;
            }
            if (*(char *)(lVar42 + lVar35) != '\0') goto LAB_0017a0e3;
            uVar8 = (ulong)(iVar41 + iVar40 + 2);
            *(undefined4 *)(lVar33 + lVar38 + 8 + lVar35 * 4) = *(undefined4 *)(lVar21 + lVar25);
LAB_0017ac89:
            lVar33 = (long)(int)uVar8;
            uVar9 = lVar33 + 2;
            if ((int)uVar9 < iVar28) {
              if (*(char *)(lVar26 + uVar9) == '\0') {
                if (*(char *)(lVar20 + uVar9) == '\0') goto LAB_0017ae4d;
                if (*(char *)(lVar33 + 3 + lVar26) == '\0') goto LAB_0017aee6;
                if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_0017923b;
                if (*(char *)(lVar31 + 3 + lVar33) != '\0') {
                  if (*(char *)(lVar31 + lVar33) == '\0') goto LAB_00179ec9;
                  goto LAB_0017ae05;
                }
              }
              else {
                if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_001790f3;
                if (*(char *)(lVar33 + 3 + lVar31) != '\0') {
                  if (*(char *)(lVar31 + lVar33) == '\0') {
LAB_0017ace5:
                    uVar6 = TTA::Merge(*(uint *)(lVar18 + 8 + lVar33 * 4),
                                       *(uint *)(lVar21 + lVar33 * 4));
                    *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
                  }
                  else {
LAB_0017acbd:
                    if (*(char *)(lVar14 + -1 + uVar9) == '\0') {
                      uVar6 = TTA::Merge(*(uint *)(lVar18 + uVar9 * 4),
                                         *(uint *)(lVar21 + -8 + uVar9 * 4));
                      *(uint *)(lVar21 + uVar9 * 4) = uVar6;
                    }
                    else {
LAB_0017ac07:
                      lVar33 = (long)(int)uVar9;
                      if (*(char *)(lVar31 + lVar33) == '\0') {
                        uVar6 = *(uint *)(lVar18 + lVar33 * 4);
                        if (*(char *)(lVar14 + lVar33) == '\0') {
                          uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + lVar33 * 4));
                          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
                        }
                        else {
                          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
                        }
                      }
                      else {
                        *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
                      }
                    }
                  }
                  goto LAB_0017b26f;
                }
                if (*(char *)(lVar26 + 3 + lVar33) == '\0') {
                  if (*(char *)(lVar31 + uVar9) == '\0') goto LAB_0017b094;
                  if (*(char *)(lVar31 + lVar33) != '\0') goto LAB_0017b07f;
                  uVar6 = TTA::Merge(*(uint *)(lVar18 + 8 + lVar33 * 4),
                                     *(uint *)(lVar21 + lVar33 * 4));
                  *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
                  goto LAB_00179cf3;
                }
              }
              if (*(char *)(lVar33 + 4 + lVar31) == '\0') {
                if (*(char *)(lVar31 + 2 + lVar33) == '\0') goto LAB_0017b0d2;
                if (*(char *)(lVar31 + lVar33) == '\0') {
                  uVar6 = TTA::Merge(*(uint *)(lVar18 + 8 + lVar33 * 4),
                                     *(uint *)(lVar21 + lVar33 * 4));
                  *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
                  uVar8 = uVar9 & 0xffffffff;
                  goto LAB_0017a371;
                }
LAB_0017b0b3:
                uVar8 = uVar9 & 0xffffffff;
                uVar6 = *(uint *)(lVar18 + uVar9 * 4);
                if (*(char *)(lVar14 + -1 + uVar9) == '\0') {
                  uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + uVar9 * 4));
                  *(uint *)(lVar21 + uVar9 * 4) = uVar6;
                }
                else {
                  *(uint *)(lVar21 + uVar9 * 4) = uVar6;
                }
LAB_0017a371:
                lVar33 = (long)(int)uVar8;
                uVar9 = lVar33 + 2;
                iVar41 = (int)uVar9;
                if (iVar41 < iVar28) {
                  if (*(char *)(lVar26 + uVar9) == '\0') {
                    if (*(char *)(lVar20 + uVar9) == '\0') goto LAB_00179f68;
                    if (*(char *)(lVar33 + 3 + lVar26) == '\0') goto LAB_0017a4a4;
                    if (*(char *)(lVar31 + 3 + lVar33) != '\0') {
                      uVar8 = uVar9;
                      if (*(char *)(lVar14 + uVar9) != '\0') goto LAB_0017a901;
                      uVar6 = TTA::Merge(*(uint *)(lVar18 + 8 + lVar33 * 4),
                                         *(uint *)(lVar21 + lVar33 * 4));
                      *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
                      goto LAB_0017ab1b;
                    }
                  }
                  else {
                    if (*(char *)(lVar33 + 3 + lVar31) != '\0') {
                      uVar8 = uVar9;
                      if (*(char *)(lVar14 + uVar9) == '\0') goto LAB_0017ace5;
LAB_0017a797:
                      uVar6 = *(uint *)(lVar18 + uVar8 * 4);
                      if (*(char *)(lVar14 + -1 + uVar8) == '\0') {
                        uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + uVar8 * 4));
                        *(uint *)(lVar21 + uVar8 * 4) = uVar6;
                      }
                      else {
                        *(uint *)(lVar21 + uVar8 * 4) = uVar6;
                      }
                      goto LAB_0017b26f;
                    }
                    if (*(char *)(lVar26 + 3 + lVar33) == '\0') {
LAB_0017a4ba:
                      *(undefined4 *)(lVar21 + 8 + lVar33 * 4) =
                           *(undefined4 *)(lVar21 + lVar33 * 4);
                      uVar8 = uVar9 & 0xffffffff;
                      goto LAB_0017ac89;
                    }
                  }
                  if (*(char *)(lVar33 + 4 + lVar31) == '\0') {
LAB_0017a4cb:
                    *(undefined4 *)(lVar21 + 8 + lVar33 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
                    uVar8 = uVar9 & 0xffffffff;
LAB_0017a579:
                    iVar41 = (int)uVar8;
                    lVar10 = (long)iVar41;
                    lVar32 = lVar10 << 0x20;
                    lVar33 = lVar1 + lVar12 * lVar43 + lVar10;
                    lVar27 = lVar1 + 3 + lVar22 + lVar10;
                    lVar16 = lVar13 + lVar10 * 4;
                    lVar34 = lVar38 + lVar16 + 8;
                    lVar15 = 0;
LAB_0017a5d8:
                    uVar23 = lVar10 + lVar15 + 2;
                    lVar35 = lVar32 >> 0x20;
                    if (lVar29 <= (long)uVar23) {
                      uVar9 = (ulong)(iVar41 + 2) + lVar15;
                      if (iVar28 < (int)uVar9) {
                        uVar9 = uVar9 & 0xffffffff;
                        goto LAB_0017ab5f;
                      }
                      uVar23 = uVar23 & 0xffffffff;
                      if (*(char *)(lVar26 + uVar23) != '\0') {
LAB_0017a815:
                        if (*(char *)(lVar31 + 3 + lVar35) == '\0') goto LAB_0017a98f;
                        if (*(char *)(lVar14 + uVar23) == '\0') {
                          uVar6 = *(uint *)(lVar18 + uVar23 * 4);
                          uVar7 = *(uint *)(lVar21 + lVar35 * 4);
LAB_00179a57:
                          uVar6 = TTA::Merge(uVar6,uVar7);
                          goto LAB_0017b96c;
                        }
                        goto LAB_0017aeac;
                      }
                      if (*(char *)(lVar20 + uVar23) == '\0') {
                        uVar9 = uVar9 & 0xffffffff;
                        goto LAB_0017aae8;
                      }
                      if (*(char *)(lVar26 + 3 + lVar35) != '\0') goto LAB_0017a815;
LAB_0017a98f:
                      uVar11 = *(undefined4 *)(lVar21 + lVar35 * 4);
                      goto LAB_0017ab12;
                    }
                    lVar42 = lVar32 >> 0x1e;
                    iVar40 = (int)lVar15;
                    if (*(char *)(lVar27 + -1 + lVar15) == '\0') {
                      if (*(char *)(lVar12 * local_60 + lVar10 + lVar1 + 2 + lVar15) == '\0') {
                        uVar9 = (ulong)(iVar40 + iVar41 + 2);
                        goto LAB_00179f68;
                      }
                      if (*(char *)(lVar27 + lVar15) == '\0') {
                        uVar37 = (ulong)(iVar41 + iVar40 + 2);
                        *(undefined4 *)(lVar16 + lVar38 + 8 + lVar15 * 4) =
                             *(undefined4 *)(lVar21 + lVar42);
                        goto LAB_0017984a;
                      }
                      if (*(char *)(lVar33 + 3 + lVar15) != '\0') goto LAB_0017a89d;
                    }
                    else {
                      if (*(char *)(lVar33 + 3 + lVar15) != '\0') {
                        uVar9 = (ulong)(iVar41 + 2) + lVar15;
                        if (*(char *)(lVar15 + 2 + lVar12 * lVar36 + lVar10 + lVar1) == '\0') {
                          uVar6 = *(uint *)(lVar19 * lVar36 + lVar10 * 4 + lVar38 + 8 + lVar15 * 4);
                          uVar7 = *(uint *)(lVar21 + lVar42);
                        }
                        else {
                          if (*(char *)(lVar31 + lVar35) != '\0') {
                            uVar8 = lVar32 + 0x200000000 >> 0x20;
                            goto LAB_0017a797;
                          }
                          uVar6 = *(uint *)(lVar19 * lVar36 + lVar10 * 4 + lVar38 + 8 + lVar15 * 4);
                          uVar7 = *(uint *)(lVar21 + lVar35 * 4);
                        }
                        uVar6 = TTA::Merge(uVar6,uVar7);
                        *(uint *)(lVar34 + lVar15 * 4) = uVar6;
                        uVar9 = uVar9 & 0xffffffff;
                        goto LAB_0017b26f;
                      }
                      if (*(char *)(lVar27 + lVar15) == '\0') {
                        uVar8 = (ulong)(iVar41 + iVar40 + 2);
                        *(undefined4 *)(lVar16 + lVar38 + 8 + lVar15 * 4) =
                             *(undefined4 *)(lVar21 + lVar42);
                        goto LAB_0017ac89;
                      }
                    }
                    if (*(char *)(lVar33 + 4 + lVar15) == '\0') goto code_r0x0017a627;
                    uVar8 = (ulong)(iVar41 + 2) + lVar15;
                    if (((*(char *)(lVar14 + 3 + lVar35) == '\0') ||
                        (*(char *)(lVar15 + 2 + lVar12 * lVar36 + lVar10 + lVar1) == '\0')) ||
                       (*(char *)(lVar31 + lVar35) == '\0')) {
                      uVar6 = TTA::Merge(*(uint *)(lVar19 * lVar36 + lVar10 * 4 + lVar38 + 0x10 +
                                                  lVar15 * 4),*(uint *)(lVar21 + lVar35 * 4));
                      *(uint *)(lVar34 + lVar15 * 4) = uVar6;
                      goto LAB_00179fd5;
                    }
                    uVar9 = lVar32 + 0x200000000 >> 0x20;
                    goto LAB_0017a6cf;
                  }
                  if (*(char *)(lVar14 + 3 + lVar33) == '\0') {
                    uVar6 = TTA::Merge(*(uint *)(lVar18 + 0x10 + lVar33 * 4),
                                       *(uint *)(lVar21 + lVar33 * 4));
                    *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
                    uVar8 = uVar9 & 0xffffffff;
                  }
                  else if (*(char *)(lVar14 + uVar9) == '\0') {
                    uVar6 = TTA::Merge(*(uint *)(lVar18 + 0x10 + lVar33 * 4),
                                       *(uint *)(lVar21 + lVar33 * 4));
                    *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
                    uVar8 = uVar9 & 0xffffffff;
                  }
                  else {
                    uVar8 = uVar9 & 0xffffffff;
LAB_0017a6cf:
                    uVar6 = *(uint *)(lVar18 + 8 + uVar9 * 4);
                    if (*(char *)(lVar14 + -1 + uVar9) == '\0') {
                      uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + uVar9 * 4));
                      *(uint *)(lVar21 + uVar9 * 4) = uVar6;
                    }
                    else {
                      *(uint *)(lVar21 + uVar9 * 4) = uVar6;
                    }
                  }
                  goto LAB_00179fd5;
                }
                if (iVar28 < iVar41) goto LAB_0017ab5f;
                uVar23 = uVar9 & 0xffffffff;
                if (*(char *)(lVar26 + uVar23) == '\0') {
                  if (*(char *)(lVar20 + uVar23) == '\0') {
LAB_0017aae8:
                    iVar17 = (int)uVar9;
                    uVar23 = (ulong)iVar17;
                    if (*(char *)(uVar23 + 1 + lVar26) == '\0') goto LAB_0017b95a;
                    if (*(char *)(lVar31 + 1 + uVar23) == '\0') goto LAB_0017b964;
                    uVar11 = *(undefined4 *)(lVar18 + uVar23 * 4);
LAB_0017ab12:
                    *(undefined4 *)(lVar21 + uVar23 * 4) = uVar11;
                    goto LAB_0017b97f;
                  }
                  if (*(char *)(lVar26 + 3 + lVar33) == '\0') {
LAB_0017a492:
                    *(undefined4 *)(lVar21 + uVar23 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
                    goto LAB_0017b97f;
                  }
                }
                if (*(char *)(lVar31 + 3 + lVar33) == '\0') goto LAB_0017aed9;
                if (*(char *)(lVar14 + uVar23) != '\0') goto LAB_0017aebf;
                uVar6 = TTA::Merge(*(uint *)(lVar18 + uVar23 * 4),*(uint *)(lVar21 + lVar33 * 4));
                *(uint *)(lVar21 + uVar23 * 4) = uVar6;
                goto LAB_0017b97f;
              }
              if (*(char *)(lVar14 + 3 + lVar33) != '\0') {
                if (*(char *)(lVar31 + lVar33) == '\0') goto LAB_0017b142;
LAB_0017af74:
                uVar8 = uVar9 & 0xffffffff;
                uVar37 = uVar9;
                if (*(char *)(lVar14 + -1 + uVar9) != '\0') goto LAB_0017ac46;
                goto LAB_0017af8a;
              }
              if (*(char *)(lVar31 + uVar9) == '\0') {
LAB_0017b142:
                uVar7 = *(uint *)(lVar18 + 0x10 + lVar33 * 4);
                v = *(uint *)(lVar21 + lVar33 * 4);
              }
              else {
                if (*(char *)(lVar31 + lVar33) != '\0') {
LAB_0017b120:
                  uVar8 = uVar9 & 0xffffffff;
                  if (*(char *)(lVar14 + -1 + uVar9) == '\0') {
                    uVar6 = TTA::Merge(*(uint *)(lVar18 + uVar9 * 4),
                                       *(uint *)(lVar18 + 8 + uVar9 * 4));
                    uVar7 = *(uint *)(lVar21 + -8 + uVar9 * 4);
                  }
                  else {
                    uVar6 = *(uint *)(lVar18 + 8 + uVar9 * 4);
                    uVar7 = *(uint *)(lVar21 + -8 + uVar9 * 4);
                  }
                  uVar6 = TTA::Merge(uVar6,uVar7);
                  *(uint *)(lVar21 + uVar9 * 4) = uVar6;
                  goto LAB_00179fd5;
                }
                uVar7 = TTA::Merge(*(uint *)(lVar18 + 8 + lVar33 * 4),
                                   *(uint *)(lVar18 + 0x10 + lVar33 * 4));
                v = *(uint *)(lVar21 + lVar33 * 4);
              }
              uVar6 = (uint)uVar9;
              uVar7 = TTA::Merge(uVar7,v);
              *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar7;
LAB_00179fa2:
              uVar8 = (ulong)uVar6;
              goto LAB_00179fd5;
            }
            uVar23 = uVar9 & 0xffffffff;
            if (iVar28 < (int)uVar9) {
              if (*(char *)(lVar26 + uVar23) == '\0') {
LAB_0017ad2a:
                iVar41 = (int)uVar9;
                if (*(char *)(lVar20 + uVar23) == '\0') {
                  *(undefined4 *)(lVar21 + uVar23 * 4) = 0;
                }
                else {
LAB_0017ad39:
                  lVar26 = (long)iVar41;
                  if (*(char *)(lVar20 + -1 + lVar26) == '\0') {
                    uVar6 = TTA::NewLabel();
                    *(uint *)(lVar21 + lVar26 * 4) = uVar6;
                  }
                  else {
                    *(undefined4 *)(lVar21 + lVar26 * 4) = *(undefined4 *)(lVar21 + -8 + lVar26 * 4)
                    ;
                  }
                }
                goto LAB_0017b97f;
              }
              if (*(char *)(lVar20 + 1 + lVar33) == '\0') {
LAB_0017ad18:
                uVar37 = uVar9 & 0xffffffff;
LAB_0017ad20:
                iVar17 = (int)uVar37;
                goto LAB_0017912b;
              }
            }
            else {
              if (*(char *)(lVar26 + uVar23) == '\0') {
                if (*(char *)(lVar20 + uVar23) == '\0') {
LAB_0017af13:
                  uVar37 = uVar9 & 0xffffffff;
                  goto LAB_0017b944;
                }
                if (*(char *)(lVar26 + 3 + lVar33) == '\0') {
LAB_0017af06:
                  iVar41 = (int)uVar9;
                  goto LAB_0017ad39;
                }
              }
              if (*(char *)(lVar20 + 1 + lVar33) == '\0') {
LAB_0017adc1:
                iVar17 = (int)uVar9;
                goto LAB_00179091;
              }
              if (*(char *)(lVar31 + 3 + lVar33) != '\0') {
                if (*(char *)(lVar31 + lVar33) == '\0') {
                  uVar6 = TTA::Merge(*(uint *)(lVar18 + uVar23 * 4),*(uint *)(lVar21 + lVar33 * 4));
                  *(uint *)(lVar21 + uVar23 * 4) = uVar6;
                }
                else {
LAB_0017ad8f:
                  lVar26 = (long)(int)uVar9;
                  if (*(char *)(lVar14 + -1 + lVar26) != '\0') goto LAB_0017b85c;
                  uVar6 = TTA::Merge(*(uint *)(lVar18 + lVar26 * 4),
                                     *(uint *)(lVar21 + -8 + lVar26 * 4));
                  *(uint *)(lVar21 + lVar26 * 4) = uVar6;
                }
                goto LAB_0017b97f;
              }
            }
            if (*(char *)(lVar31 + uVar23) == '\0') {
LAB_0017aed9:
              *(undefined4 *)(lVar21 + uVar23 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
              goto LAB_0017b97f;
            }
LAB_0017aeac:
            iVar41 = (int)uVar9;
            lVar26 = (long)iVar41;
            if (*(char *)(lVar26 + -2 + lVar31) == '\0') {
              uVar6 = *(uint *)(lVar18 + lVar26 * 4);
            }
            else {
LAB_0017aebf:
              lVar26 = (long)iVar41;
              uVar6 = *(uint *)(lVar18 + lVar26 * 4);
              if (*(char *)(lVar14 + -1 + lVar26) != '\0') {
                *(uint *)(lVar21 + lVar26 * 4) = uVar6;
                goto LAB_0017b97f;
              }
            }
            uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + lVar26 * 4));
            *(uint *)(lVar21 + lVar26 * 4) = uVar6;
          }
          else {
            uVar9 = (ulong)(iVar41 + 2) + lVar35;
            iVar17 = (int)uVar9;
            if (iVar17 <= iVar28) {
              uVar8 = uVar8 & 0xffffffff;
              if (*(char *)(lVar26 + uVar8) == '\0') {
                cVar2 = *(char *)(lVar26 + 3 + lVar24);
                if (*(char *)(lVar20 + uVar8) != '\0') {
                  if (cVar2 != '\0') goto LAB_0017a23f;
                  goto LAB_0017a331;
                }
                if (cVar2 == '\0') goto LAB_0017b95a;
              }
              else {
LAB_0017a23f:
                if (*(char *)(lVar31 + 3 + lVar24) == '\0') {
LAB_0017a331:
                  uVar11 = *(undefined4 *)(lVar21 + lVar24 * 4);
                  goto LAB_0017ab92;
                }
              }
              uVar11 = *(undefined4 *)(lVar18 + uVar8 * 4);
              goto LAB_0017ab92;
            }
            uVar9 = uVar9 & 0xffffffff;
LAB_0017ab5f:
            uVar8 = (ulong)(int)uVar9;
            if (*(char *)(lVar26 + uVar8) == '\0') {
LAB_0017ab82:
              if (*(char *)(lVar20 + uVar8) == '\0') {
                *(undefined4 *)(lVar21 + uVar8 * 4) = 0;
                goto LAB_0017b97f;
              }
              uVar11 = *(undefined4 *)(lVar21 + -8 + uVar8 * 4);
LAB_0017ab92:
              *(undefined4 *)(lVar21 + uVar8 * 4) = uVar11;
            }
            else {
              *(undefined4 *)(lVar21 + uVar8 * 4) = *(undefined4 *)(lVar21 + -8 + uVar8 * 4);
            }
          }
          goto LAB_0017b97f;
        }
        if (*(char *)(lVar1 + lVar15 + 2 + lVar44) == '\0') goto LAB_0017b512;
        *(undefined4 *)(lVar10 + lVar44 * 4) = *(undefined4 *)(lVar34 + lVar44 * 4);
        lVar42 = lVar42 + 0x200000000;
        lVar44 = lVar44 + 2;
      } while( true );
    }
    if (uVar30 == 2) {
      uVar8 = 0;
      iVar17 = 0;
      if (cVar2 == '\0') {
LAB_0017945b:
        iVar17 = (int)uVar8;
        uVar23 = (ulong)iVar17;
        if (*(char *)(lVar20 + uVar23) == '\0') {
          uVar37 = uVar8 & 0xffffffff;
LAB_0017b944:
          iVar17 = (int)uVar37;
          if (*(char *)(lVar26 + 1 + (long)iVar17) != '\0') goto LAB_00179091;
LAB_0017b95a:
          uVar23 = (ulong)iVar17;
          if (*(char *)(lVar20 + 1 + uVar23) == '\0') {
            *(undefined4 *)(lVar21 + uVar23 * 4) = 0;
            goto LAB_0017b97f;
          }
        }
        else if (*(char *)(lVar26 + 1 + uVar23) != '\0') goto LAB_00179091;
LAB_0017b964:
        uVar6 = TTA::NewLabel();
LAB_0017b96c:
        *(uint *)(lVar21 + uVar23 * 4) = uVar6;
      }
      else {
LAB_00179091:
        uVar9 = (ulong)iVar17;
        if (*(char *)(lVar31 + 1 + uVar9) == '\0') goto LAB_0017912b;
LAB_001790a2:
        uVar11 = *(undefined4 *)(lVar18 + uVar9 * 4);
LAB_001790a5:
        *(undefined4 *)(lVar21 + uVar9 * 4) = uVar11;
      }
    }
    else {
      iVar17 = 0;
      iVar41 = 0;
      if (cVar2 == '\0') {
LAB_001793d8:
        uVar23 = (ulong)iVar41;
        if (*(char *)(lVar20 + uVar23) != '\0') goto LAB_001793e1;
        *(undefined4 *)(lVar21 + uVar23 * 4) = 0;
      }
      else {
LAB_0017912b:
        uVar23 = (ulong)iVar17;
        if (*(char *)(lVar31 + uVar23) == '\0') {
LAB_001793e1:
          uVar6 = TTA::NewLabel();
LAB_001793e9:
          *(uint *)(lVar21 + uVar23 * 4) = uVar6;
        }
        else {
LAB_00179138:
          *(undefined4 *)(lVar21 + uVar23 * 4) = *(undefined4 *)(lVar18 + uVar23 * 4);
        }
      }
    }
LAB_0017b97f:
    lVar39 = lVar39 + 2;
    lVar36 = lVar36 + 2;
    lVar43 = lVar43 + 2;
    local_60 = local_60 + 2;
  } while( true );
LAB_00178fd1:
  uVar6 = *(uint *)(lVar26 + -8 + uVar8 * 4);
  goto LAB_00178fd6;
LAB_0017c0d8:
  iVar41 = iVar41 + iVar40 + 2;
  *(undefined4 *)(lVar16 + lVar10 * 4) = *(undefined4 *)(lVar36 + (lVar15 >> 0x1e));
LAB_0017c13a:
  lVar33 = (long)iVar41;
  lVar10 = lVar33 << 0x20;
  lVar16 = lVar21 + lVar33;
  lVar19 = lVar20 + lVar33 * 4;
  lVar27 = 0;
LAB_0017c162:
  lVar15 = lVar10 >> 0x20;
  if (lVar29 <= lVar33 + lVar27 + 2) {
    uVar9 = (ulong)(iVar41 + 2) + lVar27;
    if (iVar28 < (int)uVar9) {
      uVar8 = uVar9 & 0xffffffff;
      goto LAB_0017c637;
    }
    uVar8 = lVar10 + 0x200000000 >> 0x20;
    if (*(char *)(lVar43 + uVar8) == '\0') {
      uVar8 = uVar9 & 0xffffffff;
LAB_0017c843:
      lVar39 = (long)(int)uVar8;
      if (*(char *)(lVar39 + 1 + lVar43) != '\0') {
        if (*(char *)(lVar13 + 1 + lVar39) == '\0') {
          uVar5 = TTA::NewLabel();
        }
        else {
          uVar5 = *(uint *)(lVar14 + lVar39 * 4);
        }
        *(uint *)(lVar36 + lVar39 * 4) = uVar5;
        return;
      }
      *(undefined4 *)(lVar36 + lVar39 * 4) = 0;
      return;
    }
    if (*(char *)(lVar13 + 3 + lVar15) == '\0') {
      uVar5 = *(uint *)(lVar36 + lVar15 * 4);
      goto LAB_0017ca27;
    }
    if ((*(char *)(lVar22 + uVar8) != '\0') && (*(char *)(lVar13 + lVar15) != '\0'))
    goto LAB_0017c753;
    uVar5 = *(uint *)(lVar14 + uVar8 * 4);
    uVar30 = *(uint *)(lVar36 + lVar15 * 4);
    goto LAB_0017ca22;
  }
  if (*(char *)(lVar1 + lVar33 + -1 + lVar27) == '\0') {
    uVar8 = (ulong)(iVar41 + (int)lVar27 + 2);
    goto LAB_0017bf00;
  }
  lVar32 = lVar10 >> 0x1e;
  if (*(char *)(lVar16 + -1 + lVar27) != '\0') goto LAB_0017c1c5;
  if (*(char *)(lVar1 + lVar33 + lVar27) == '\0') {
    *(undefined4 *)(lVar19 + lVar27 * 4) = *(undefined4 *)(lVar36 + lVar32);
    uVar8 = (ulong)(iVar41 + (int)lVar27 + 2);
    goto LAB_0017bc4b;
  }
  if (*(char *)(lVar16 + lVar27) == '\0') {
    *(undefined4 *)(lVar19 + lVar27 * 4) = *(undefined4 *)(lVar19 + -8 + lVar27 * 4);
    lVar10 = lVar10 + 0x200000000;
    lVar27 = lVar27 + 2;
    goto LAB_0017c162;
  }
  uVar8 = (ulong)(iVar41 + 2) + lVar27;
  if ((*(char *)(lVar27 + lVar12 + lVar33) == '\0') ||
     (*(char *)(lVar27 + -1 + lVar12 + lVar33) == '\0')) {
    uVar5 = *(uint *)(lVar18 + lVar33 * 4 + lVar27 * 4);
    uVar30 = *(uint *)(lVar36 + lVar32);
  }
  else {
    if (*(char *)(lVar13 + lVar15) != '\0') {
      uVar37 = lVar10 + 0x200000000 >> 0x20;
LAB_0017c27f:
      uVar5 = *(uint *)(lVar26 + uVar37 * 4);
      if (*(char *)(lVar22 + -1 + uVar37) == '\0') {
        uVar5 = TTA::Merge(uVar5,*(uint *)(lVar36 + -8 + uVar37 * 4));
LAB_0017bf54:
        *(uint *)(lVar36 + uVar37 * 4) = uVar5;
      }
      else {
        *(uint *)(lVar36 + uVar37 * 4) = uVar5;
      }
      goto LAB_0017bf68;
    }
    uVar5 = *(uint *)(lVar18 + lVar33 * 4 + lVar27 * 4);
    uVar30 = *(uint *)(lVar36 + lVar15 * 4);
  }
  uVar5 = TTA::Merge(uVar5,uVar30);
  *(uint *)(lVar19 + lVar27 * 4) = uVar5;
  goto LAB_0017bf68;
LAB_0017c1c5:
  uVar8 = (ulong)(iVar41 + 2) + lVar27;
  if (*(char *)(lVar27 + -1 + lVar12 + lVar33) == '\0') {
    uVar5 = *(uint *)(lVar18 + lVar33 * 4 + -8 + lVar27 * 4);
    uVar30 = *(uint *)(lVar36 + lVar32);
  }
  else {
    if (*(char *)(lVar13 + lVar15) != '\0') {
      uVar9 = lVar10 + 0x200000000 >> 0x20;
      goto LAB_0017c206;
    }
    uVar5 = *(uint *)(lVar18 + lVar33 * 4 + -8 + lVar27 * 4);
    uVar30 = *(uint *)(lVar36 + lVar15 * 4);
  }
  uVar5 = TTA::Merge(uVar5,uVar30);
  *(uint *)(lVar19 + lVar27 * 4) = uVar5;
LAB_0017c338:
  iVar41 = (int)uVar8;
  lVar15 = (long)iVar41;
  lVar19 = lVar18 + lVar15 * 4;
  lVar33 = lVar31 + 2 + lVar38 + lVar15;
  lVar10 = lVar15 << 0x20;
  lVar16 = lVar20 + lVar15 * 4;
  lVar27 = 0;
LAB_0017c372:
  uVar37 = lVar15 + lVar27 + 2;
  iVar40 = (int)lVar27;
  if (lVar29 <= (long)uVar37) {
    uVar8 = lVar10 + 0x200000000 >> 0x20;
    lVar39 = lVar10 >> 0x20;
    if (iVar28 < iVar40 + iVar41 + 2) {
      if (*(char *)(lVar43 + uVar8) == '\0') goto LAB_0017c80e;
      if (*(char *)(lVar43 + 1 + lVar39) != '\0') {
        uVar5 = *(uint *)(lVar36 + lVar39 * 4);
        goto LAB_0017ca27;
      }
    }
    else {
      if (*(char *)(lVar43 + uVar8) == '\0') goto LAB_0017c802;
      if (*(char *)(lVar43 + 1 + lVar39) != '\0') goto LAB_0017c686;
      if (*(char *)(lVar13 + 3 + lVar39) != '\0') {
        if (*(char *)(lVar13 + uVar8) != '\0') goto LAB_0017c963;
LAB_0017c942:
        cVar2 = *(char *)(lVar22 + uVar8);
        goto joined_r0x0017c947;
      }
    }
    if (*(char *)(lVar13 + uVar8) != '\0') goto LAB_0017c963;
    uVar5 = *(uint *)(lVar14 + (lVar10 >> 0x1e));
    goto LAB_0017ca27;
  }
  if (*(char *)(lVar1 + lVar15 + -1 + lVar27) == '\0') {
    uVar8 = (ulong)(iVar41 + iVar40 + 2);
    goto LAB_0017bc95;
  }
  if (*(char *)(lVar1 + lVar15 + -2 + lVar27) == '\0') {
    if (*(char *)(lVar33 + 1 + lVar27) != '\0') {
      if (*(char *)(lVar33 + lVar27) == '\0') goto LAB_0017c4af;
      *(undefined4 *)(lVar16 + lVar27 * 4) = *(undefined4 *)(lVar19 + -8 + lVar27 * 4);
      lVar27 = lVar27 + 2;
      lVar10 = lVar10 + 0x200000000;
      goto LAB_0017c372;
    }
    uVar8 = (ulong)(iVar41 + 2) + lVar27;
    if (*(char *)(lVar1 + lVar15 + lVar27) == '\0') {
      if (*(char *)(lVar27 + lVar33) == '\0') {
        uVar11 = *(undefined4 *)(lVar19 + -0x10 + lVar27 * 4);
      }
      else {
        uVar11 = *(undefined4 *)(lVar19 + -8 + lVar27 * 4);
      }
      *(undefined4 *)(lVar16 + lVar27 * 4) = uVar11;
      goto LAB_0017bc4b;
    }
    uVar9 = uVar8;
    if (*(char *)(lVar27 + 2 + lVar33) == '\0') {
      if (*(char *)(lVar27 + lVar33) != '\0') goto LAB_0017bcf0;
      uVar5 = *(uint *)(lVar19 + -0x10 + lVar27 * 4);
      goto LAB_0017be77;
    }
    if (*(char *)(lVar27 + lVar33) != '\0') goto LAB_0017bcc8;
    uVar9 = lVar10 + 0x200000000 >> 0x20;
LAB_0017c488:
    if ((*(char *)(lVar22 + 1 + uVar9) == '\0') || (*(char *)(lVar22 + uVar9) == '\0')) {
      uVar5 = TTA::Merge(*(uint *)(lVar14 + -8 + uVar9 * 4),*(uint *)(lVar14 + 8 + uVar9 * 4));
    }
    else {
      uVar5 = *(uint *)(lVar26 + uVar9 * 4);
    }
    *(uint *)(lVar36 + uVar9 * 4) = uVar5;
    goto LAB_0017bf68;
  }
  uVar8 = (ulong)(iVar41 + iVar40 + 2);
LAB_0017c3ea:
  iVar41 = (int)uVar8;
  lVar19 = (long)iVar41;
  if (*(char *)(lVar19 + 1 + lVar13) != '\0') {
    if (*(char *)(lVar13 + lVar19) == '\0') {
      uVar5 = *(uint *)(lVar14 + lVar19 * 4);
      if (*(char *)(lVar22 + lVar19) != '\0') {
        *(uint *)(lVar36 + lVar19 * 4) = uVar5;
        goto LAB_0017c338;
      }
      uVar5 = TTA::Merge(uVar5,*(uint *)(lVar36 + -8 + lVar19 * 4));
    }
    else {
      uVar5 = *(uint *)(lVar14 + lVar19 * 4);
    }
    *(uint *)(lVar36 + lVar19 * 4) = uVar5;
    goto LAB_0017c338;
  }
  if (*(char *)(lVar43 + 1 + lVar19) == '\0') {
    *(undefined4 *)(lVar36 + lVar19 * 4) = *(undefined4 *)(lVar36 + -8 + lVar19 * 4);
    goto LAB_0017bc4b;
  }
  if (*(char *)(lVar19 + 2 + lVar13) == '\0') {
    *(undefined4 *)(lVar36 + lVar19 * 4) = *(undefined4 *)(lVar36 + -8 + lVar19 * 4);
    goto LAB_0017c13a;
  }
  if (*(char *)(lVar22 + 1 + lVar19) == '\0') {
    uVar5 = *(uint *)(lVar14 + 8 + lVar19 * 4);
  }
  else {
    if (*(char *)(lVar13 + lVar19) != '\0') {
      uVar5 = *(uint *)(lVar14 + 8 + lVar19 * 4);
      goto LAB_0017bd82;
    }
    uVar5 = *(uint *)(lVar14 + 8 + lVar19 * 4);
    if (*(char *)(lVar22 + lVar19) != '\0') {
      *(uint *)(lVar36 + lVar19 * 4) = uVar5;
      goto LAB_0017bf68;
    }
  }
  uVar30 = *(uint *)(lVar36 + -8 + lVar19 * 4);
LAB_0017bd79:
  uVar5 = TTA::Merge(uVar5,uVar30);
  goto LAB_0017bd82;
LAB_0017c4af:
  uVar9 = lVar10 + 0x200000000 >> 0x20;
  uVar8 = (ulong)(iVar41 + iVar40 + 2);
LAB_0017c4c7:
  if (*(char *)(lVar22 + uVar9) == '\0') {
    uVar5 = TTA::Merge(*(uint *)(lVar14 + -8 + uVar9 * 4),*(uint *)(lVar14 + uVar9 * 4));
  }
  else {
    uVar5 = *(uint *)(lVar14 + uVar9 * 4);
  }
  *(uint *)(lVar36 + uVar9 * 4) = uVar5;
  goto LAB_0017c338;
LAB_0017be77:
  *(uint *)(lVar36 + uVar37 * 4) = uVar5;
  lVar19 = (long)(int)uVar9;
  uVar8 = lVar19 + 2;
  if (iVar28 <= (int)uVar8) {
    if (iVar28 < (int)uVar8) goto LAB_0017c637;
    if (*(char *)(lVar43 + uVar8) == '\0') goto LAB_0017c843;
    if (*(char *)(lVar13 + 3 + lVar19) == '\0') {
LAB_0017c9f5:
      uVar5 = *(uint *)(lVar36 + lVar19 * 4);
    }
    else {
LAB_0017c8be:
      uVar5 = TTA::Merge(*(uint *)(lVar14 + 8 + lVar19 * 4),*(uint *)(lVar36 + lVar19 * 4));
    }
    goto LAB_00178f40;
  }
  if (*(char *)(lVar43 + uVar8) == '\0') {
LAB_0017bf00:
    iVar41 = (int)uVar8;
    uVar37 = (ulong)iVar41;
    if (*(char *)(uVar37 + 1 + lVar43) == '\0') goto LAB_0017bd8b;
    uVar9 = uVar8;
    if (*(char *)(lVar13 + 1 + uVar37) != '\0') {
LAB_0017bf17:
      do {
        *(undefined4 *)(lVar36 + uVar37 * 4) = *(undefined4 *)(lVar14 + uVar37 * 4);
        uVar8 = (long)(int)uVar9 + 2;
        if (iVar28 <= (int)uVar8) {
          if (iVar28 < (int)uVar8) goto LAB_0017c637;
          if (*(char *)(lVar43 + uVar8) == '\0') goto LAB_0017c802;
          goto LAB_0017c686;
        }
        if (*(char *)(lVar43 + uVar8) != '\0') goto LAB_0017c3ea;
LAB_0017bc95:
        while( true ) {
          iVar41 = (int)uVar8;
          uVar37 = (ulong)iVar41;
          if (*(char *)(uVar37 + 1 + lVar43) != '\0') break;
LAB_0017bd8b:
          uVar37 = (ulong)iVar41;
LAB_0017bd8e:
          *(undefined4 *)(lVar36 + uVar37 * 4) = 0;
          lVar19 = (long)iVar41;
          uVar9 = lVar19 + 2;
          uVar8 = uVar9;
          if (iVar28 <= (int)uVar9) {
            if (iVar28 < (int)uVar9) {
              if (*(char *)(lVar43 + uVar9) == '\0') goto LAB_00178ee0;
LAB_0017c9ce:
              if (*(char *)(lVar13 + uVar9) == '\0') {
                if (*(char *)(lVar13 + 1 + lVar19) == '\0') goto LAB_00178f3b;
                uVar5 = *(uint *)(lVar14 + lVar19 * 4);
                goto LAB_00178f40;
              }
            }
            else {
              if (*(char *)(lVar43 + uVar9) == '\0') goto LAB_0017c802;
              if (*(char *)(lVar13 + 3 + lVar19) == '\0') goto LAB_0017c9ce;
              if ((*(char *)(lVar13 + uVar9) == '\0') && (*(char *)(lVar13 + 1 + lVar19) != '\0'))
              goto LAB_0017c942;
            }
            uVar5 = *(uint *)(lVar14 + 8 + lVar19 * 4);
            goto LAB_00178f40;
          }
          if (*(char *)(lVar43 + uVar9) != '\0') {
            if (*(char *)(lVar19 + 3 + lVar13) != '\0') {
              if ((*(char *)(lVar13 + uVar9) != '\0') || (*(char *)(lVar39 + lVar19) == '\0'))
              goto LAB_0017bdbd;
              goto LAB_0017c4c7;
            }
            if (*(char *)(lVar43 + 3 + lVar19) == '\0') {
              if (*(char *)(lVar13 + uVar9) != '\0') goto LAB_0017be15;
              if (*(char *)(lVar39 + lVar19) == '\0') goto LAB_0017bc85;
              *(undefined4 *)(lVar36 + 8 + lVar19 * 4) = *(undefined4 *)(lVar14 + lVar19 * 4);
              goto LAB_0017bc4b;
            }
            cVar2 = *(char *)(lVar19 + 2 + lVar13);
            if (*(char *)(lVar19 + 4 + lVar13) == '\0') {
              uVar37 = uVar9;
              if (cVar2 != '\0') goto LAB_0017bcf0;
              if (*(char *)(lVar39 + lVar19) == '\0') {
                uVar5 = TTA::NewLabel();
              }
              else {
                uVar5 = *(uint *)(lVar14 + lVar19 * 4);
              }
              goto LAB_0017be77;
            }
            if (cVar2 != '\0') goto LAB_0017bcc8;
            if (*(char *)(lVar39 + lVar19) != '\0') goto LAB_0017c488;
            uVar5 = *(uint *)(lVar14 + 0x10 + lVar19 * 4);
            goto LAB_0017beda;
          }
        }
        uVar9 = uVar8;
      } while (*(char *)(lVar13 + 1 + uVar37) != '\0');
      goto LAB_0017bcb0;
    }
    uVar37 = (ulong)iVar41;
    if (*(char *)(uVar37 + 2 + lVar13) == '\0') goto LAB_0017bf5a;
LAB_0017bf4f:
    uVar5 = *(uint *)(lVar14 + 8 + uVar37 * 4);
    goto LAB_0017bf54;
  }
  if (*(char *)(lVar19 + 3 + lVar13) == '\0') goto LAB_0017beba;
LAB_0017be9e:
  uVar5 = TTA::Merge(*(uint *)(lVar14 + 8 + lVar19 * 4),*(uint *)(lVar36 + lVar19 * 4));
LAB_0017beb0:
  *(uint *)(lVar36 + 8 + lVar19 * 4) = uVar5;
  goto LAB_0017c338;
LAB_0017c686:
  if (*(char *)(lVar13 + 1 + uVar8) == '\0') {
    uVar5 = *(uint *)(lVar36 + -8 + uVar8 * 4);
    goto LAB_0017ca27;
  }
  if (*(char *)(lVar13 + uVar8) != '\0') goto LAB_0017c963;
  uVar5 = *(uint *)(lVar14 + uVar8 * 4);
  if (*(char *)(lVar22 + uVar8) != '\0') {
    *(uint *)(lVar36 + uVar8 * 4) = uVar5;
    return;
  }
  uVar30 = *(uint *)(lVar36 + -8 + uVar8 * 4);
  goto LAB_0017ca22;
LAB_0017bdbd:
  uVar5 = *(uint *)(lVar14 + 8 + lVar19 * 4);
  goto LAB_0017beb0;
LAB_0017bcf0:
  *(undefined4 *)(lVar36 + uVar37 * 4) = *(undefined4 *)(lVar14 + uVar37 * 4);
  lVar19 = (long)(int)uVar9;
  uVar8 = lVar19 + 2;
  if (iVar28 <= (int)uVar8) {
    if (iVar28 < (int)uVar8) goto LAB_0017c637;
    if (*(char *)(lVar43 + uVar8) == '\0') goto LAB_0017c843;
    if (*(char *)(lVar13 + 3 + lVar19) == '\0') goto LAB_0017c9f5;
    if (*(char *)(lVar22 + uVar8) == '\0') goto LAB_0017c8be;
    goto LAB_0017c753;
  }
  if (*(char *)(lVar43 + uVar8) == '\0') goto LAB_0017bf00;
  if (*(char *)(lVar19 + 3 + lVar13) == '\0') {
    if (*(char *)(lVar43 + 3 + lVar19) == '\0') goto LAB_0017bee4;
    if (*(char *)(lVar19 + 4 + lVar13) == '\0') goto LAB_0017bef2;
    if ((*(char *)(lVar22 + 3 + lVar19) == '\0') ||
       (uVar37 = uVar8, *(char *)(lVar22 + uVar8) == '\0')) goto LAB_0017bec8;
    goto LAB_0017c27f;
  }
  uVar9 = uVar8;
  if (*(char *)(lVar22 + uVar8) == '\0') goto LAB_0017be9e;
LAB_0017c206:
  if (*(char *)(lVar22 + -1 + uVar9) == '\0') {
    uVar5 = TTA::Merge(*(uint *)(lVar14 + -8 + uVar9 * 4),*(uint *)(lVar14 + uVar9 * 4));
  }
  else {
    uVar5 = *(uint *)(lVar14 + uVar9 * 4);
  }
  *(uint *)(lVar36 + uVar9 * 4) = uVar5;
  goto LAB_0017c338;
LAB_0017c753:
  cVar2 = *(char *)(lVar22 + -1 + uVar8);
joined_r0x0017c947:
  if (cVar2 != '\0') goto LAB_0017c963;
  uVar5 = *(uint *)(lVar14 + -8 + uVar8 * 4);
  uVar30 = *(uint *)(lVar14 + uVar8 * 4);
LAB_0017ca22:
  uVar5 = TTA::Merge(uVar5,uVar30);
  goto LAB_0017ca27;
LAB_0017bf5a:
  uVar5 = TTA::NewLabel();
  goto LAB_0017be77;
LAB_0017beba:
  if (*(char *)(lVar43 + 3 + lVar19) == '\0') {
LAB_0017bee4:
    *(undefined4 *)(lVar36 + 8 + lVar19 * 4) = *(undefined4 *)(lVar36 + lVar19 * 4);
    goto LAB_0017bc4b;
  }
  if (*(char *)(lVar19 + 4 + lVar13) != '\0') goto LAB_0017bec8;
LAB_0017bef2:
  iVar41 = (int)uVar8;
  *(undefined4 *)(lVar36 + 8 + lVar19 * 4) = *(undefined4 *)(lVar36 + lVar19 * 4);
  goto LAB_0017c13a;
LAB_0017bec8:
  uVar5 = TTA::Merge(*(uint *)(lVar14 + 0x10 + lVar19 * 4),*(uint *)(lVar36 + lVar19 * 4));
LAB_0017beda:
  *(uint *)(lVar36 + 8 + lVar19 * 4) = uVar5;
  goto LAB_0017bf68;
LAB_0017a89d:
  uVar9 = (ulong)(iVar41 + 2) + lVar15;
  if (*(char *)(lVar15 + 2 + lVar12 * lVar36 + lVar10 + lVar1) == '\0') {
    uVar6 = TTA::Merge(*(uint *)(lVar19 * lVar36 + lVar10 * 4 + lVar38 + 8 + lVar15 * 4),
                       *(uint *)(lVar21 + lVar42));
    *(uint *)(lVar34 + lVar15 * 4) = uVar6;
    uVar9 = uVar9 & 0xffffffff;
  }
  else if (*(char *)(lVar31 + lVar35) == '\0') {
    uVar6 = TTA::Merge(*(uint *)(lVar19 * lVar36 + lVar10 * 4 + lVar38 + 8 + lVar15 * 4),
                       *(uint *)(lVar21 + lVar35 * 4));
    *(uint *)(lVar34 + lVar15 * 4) = uVar6;
  }
  else {
    uVar9 = uVar9 & 0xffffffff;
    uVar8 = lVar32 + 0x200000000 >> 0x20;
LAB_0017a901:
    uVar6 = *(uint *)(lVar18 + uVar8 * 4);
    if (*(char *)(lVar14 + -1 + uVar8) == '\0') {
      uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + uVar8 * 4));
      *(uint *)(lVar21 + uVar8 * 4) = uVar6;
    }
    else {
      *(uint *)(lVar21 + uVar8 * 4) = uVar6;
    }
  }
LAB_0017ab1b:
  lVar33 = (long)(int)uVar9;
  uVar37 = lVar33 + 2;
  if (iVar28 <= (int)uVar37) {
    if (iVar28 < (int)uVar37) {
      uVar9 = uVar37 & 0xffffffff;
      goto LAB_0017ab5f;
    }
    uVar8 = uVar37 & 0xffffffff;
    if (*(char *)(lVar26 + uVar8) != '\0') goto LAB_0017b851;
    if (*(char *)(lVar20 + uVar8) == '\0') goto LAB_0017b93f;
    if (*(char *)(lVar26 + 3 + lVar33) != '\0') goto LAB_0017b851;
    *(undefined4 *)(lVar21 + uVar8 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
    goto LAB_0017b97f;
  }
  uVar8 = uVar37;
  if (*(char *)(lVar26 + uVar37) != '\0') goto LAB_0017abf9;
  if (*(char *)(lVar20 + uVar37) == '\0') goto LAB_00179229;
  if (*(char *)(lVar26 + 3 + lVar33) == '\0') {
    *(undefined4 *)(lVar21 + 8 + lVar33 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
LAB_0017984a:
    lVar33 = (long)(int)uVar37;
    uVar8 = lVar33 + 2;
    iVar41 = (int)uVar8;
    if (iVar41 < iVar28) {
      if (*(char *)(lVar26 + uVar8) == '\0') {
        uVar9 = uVar8 & 0xffffffff;
        goto LAB_001796a6;
      }
      if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_001794d1;
LAB_00179880:
      lVar33 = (long)(int)uVar8;
      if (*(char *)(lVar33 + 1 + lVar31) != '\0') {
        if ((*(char *)(lVar31 + lVar33) == '\0') && (*(char *)(lVar31 + -1 + lVar33) != '\0')) {
          if (*(char *)(lVar14 + lVar33) == '\0') {
            uVar6 = TTA::Merge(*(uint *)(lVar18 + -8 + lVar33 * 4),*(uint *)(lVar18 + lVar33 * 4));
            uVar7 = *(uint *)(lVar21 + -8 + lVar33 * 4);
          }
          else {
            uVar6 = *(uint *)(lVar18 + lVar33 * 4);
            uVar7 = *(uint *)(lVar21 + -8 + lVar33 * 4);
          }
          uVar6 = TTA::Merge(uVar6,uVar7);
          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
          uVar9 = uVar8 & 0xffffffff;
        }
        else {
          uVar6 = TTA::Merge(*(uint *)(lVar18 + lVar33 * 4),*(uint *)(lVar21 + -8 + lVar33 * 4));
          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
LAB_001798bc:
          uVar9 = uVar8 & 0xffffffff;
        }
        goto LAB_0017b26f;
      }
      if (*(char *)(lVar26 + 1 + lVar33) == '\0') {
        uVar37 = (ulong)(int)uVar8;
        uVar9 = uVar8;
        if (*(char *)(lVar31 + -1 + uVar37) == '\0') goto LAB_00179bae;
        uVar6 = TTA::Merge(*(uint *)(lVar18 + -8 + uVar37 * 4),*(uint *)(lVar21 + -8 + uVar37 * 4));
        goto LAB_0017ac7b;
      }
      if (*(char *)(lVar33 + 2 + lVar31) != '\0') {
        if (*(char *)(lVar31 + lVar33) != '\0') {
          if (*(char *)(lVar14 + 1 + lVar33) == '\0') {
            uVar6 = TTA::Merge(*(uint *)(lVar18 + lVar33 * 4),*(uint *)(lVar18 + 8 + lVar33 * 4));
            uVar7 = *(uint *)(lVar21 + -8 + lVar33 * 4);
          }
          else {
            uVar6 = *(uint *)(lVar18 + 8 + lVar33 * 4);
            uVar7 = *(uint *)(lVar21 + -8 + lVar33 * 4);
          }
          uVar6 = TTA::Merge(uVar6,uVar7);
          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
          goto LAB_00179fd5;
        }
        if (*(char *)(lVar31 + -1 + lVar33) == '\0') {
          uVar6 = *(uint *)(lVar18 + 8 + lVar33 * 4);
          uVar7 = *(uint *)(lVar21 + -8 + lVar33 * 4);
        }
        else {
          if (*(char *)(lVar14 + 1 + lVar33) != '\0') {
            if (*(char *)(lVar14 + lVar33) == '\0') {
              uVar6 = TTA::Merge(*(uint *)(lVar18 + -8 + lVar33 * 4),
                                 *(uint *)(lVar18 + 8 + lVar33 * 4));
              uVar7 = *(uint *)(lVar21 + -8 + lVar33 * 4);
            }
            else {
              uVar6 = *(uint *)(lVar18 + 8 + lVar33 * 4);
              uVar7 = *(uint *)(lVar21 + -8 + lVar33 * 4);
            }
            uVar6 = TTA::Merge(uVar6,uVar7);
            *(uint *)(lVar21 + lVar33 * 4) = uVar6;
            goto LAB_00179fd5;
          }
          uVar6 = TTA::Merge(*(uint *)(lVar18 + -8 + lVar33 * 4),*(uint *)(lVar18 + 8 + lVar33 * 4))
          ;
          uVar7 = *(uint *)(lVar21 + -8 + lVar33 * 4);
        }
        uVar6 = TTA::Merge(uVar6,uVar7);
        *(uint *)(lVar21 + lVar33 * 4) = uVar6;
        goto LAB_00179fd5;
      }
      if (*(char *)(lVar31 + -1 + lVar33) != '\0') {
        uVar6 = TTA::Merge(*(uint *)(lVar18 + -8 + lVar33 * 4),*(uint *)(lVar21 + -8 + lVar33 * 4));
        *(uint *)(lVar21 + lVar33 * 4) = uVar6;
        goto LAB_0017a579;
      }
LAB_00179782:
      if (*(char *)(lVar31 + lVar33) != '\0') {
        uVar6 = TTA::Merge(*(uint *)(lVar18 + lVar33 * 4),*(uint *)(lVar21 + -8 + lVar33 * 4));
        *(uint *)(lVar21 + lVar33 * 4) = uVar6;
        goto LAB_0017a371;
      }
      *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar21 + -8 + lVar33 * 4);
LAB_00179e1b:
      lVar33 = (long)(int)uVar8;
      uVar9 = lVar33 + 2;
      if (iVar28 <= (int)uVar9) {
        if (iVar28 < (int)uVar9) goto LAB_0017ab5f;
        uVar23 = uVar9 & 0xffffffff;
        if (*(char *)(lVar26 + uVar23) == '\0') {
          if (*(char *)(lVar20 + uVar23) == '\0') goto LAB_0017aae8;
          if (*(char *)(lVar26 + 3 + lVar33) == '\0') goto LAB_0017a492;
        }
        if (*(char *)(lVar31 + 3 + lVar33) == '\0') {
          *(undefined4 *)(lVar21 + uVar23 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
        }
        else {
          uVar6 = TTA::Merge(*(uint *)(lVar18 + uVar23 * 4),*(uint *)(lVar21 + lVar33 * 4));
          *(uint *)(lVar21 + uVar23 * 4) = uVar6;
        }
        goto LAB_0017b97f;
      }
      if (*(char *)(lVar26 + uVar9) != '\0') {
        if (*(char *)(lVar33 + 3 + lVar31) != '\0') goto LAB_0017ace5;
        if (*(char *)(lVar26 + 3 + lVar33) == '\0') goto LAB_0017a4ba;
LAB_00179efd:
        if (*(char *)(lVar33 + 4 + lVar31) == '\0') goto LAB_0017a4cb;
        uVar6 = TTA::Merge(*(uint *)(lVar18 + 0x10 + lVar33 * 4),*(uint *)(lVar21 + lVar33 * 4));
        *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
        uVar8 = uVar9 & 0xffffffff;
        goto LAB_00179fd5;
      }
      if (*(char *)(lVar20 + uVar9) != '\0') goto code_r0x00179eb1;
LAB_00179f68:
      uVar6 = (uint)uVar9;
      lVar33 = (long)(int)uVar6;
      if (*(char *)(lVar33 + 1 + lVar26) != '\0') {
        if (*(char *)(lVar31 + 1 + lVar33) != '\0') {
          *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
          goto LAB_0017ab1b;
        }
        if (*(char *)(lVar33 + 2 + lVar31) != '\0') {
          *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + 8 + lVar33 * 4);
          goto LAB_00179fa2;
        }
        uVar7 = TTA::NewLabel();
        *(uint *)(lVar21 + lVar33 * 4) = uVar7;
LAB_00179fc8:
        uVar8 = (ulong)uVar6;
        goto LAB_00179e1b;
      }
      uVar8 = uVar9 & 0xffffffff;
LAB_001792ef:
      lVar33 = (long)(int)uVar8;
      if (*(char *)(lVar20 + 1 + lVar33) != '\0') {
        uVar6 = TTA::NewLabel();
        *(uint *)(lVar21 + lVar33 * 4) = uVar6;
        uVar37 = lVar33 + 2;
        iVar41 = (int)uVar37;
        if (iVar41 < iVar28) {
          if (*(char *)(lVar26 + uVar37) != '\0') {
            uVar8 = uVar37 & 0xffffffff;
            goto LAB_00179880;
          }
          if (*(char *)(lVar20 + uVar37) == '\0') {
            uVar8 = uVar37 & 0xffffffff;
            goto LAB_00179229;
          }
          if (*(char *)(lVar26 + 3 + lVar33) != '\0') {
            uVar9 = uVar37 & 0xffffffff;
            goto LAB_001796cf;
          }
          *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
          uVar37 = uVar37 & 0xffffffff;
          goto LAB_0017984a;
        }
        uVar8 = uVar37 & 0xffffffff;
        if (iVar28 < iVar41) {
          if (*(char *)(lVar26 + uVar8) != '\0') goto LAB_0017991e;
          uVar8 = (ulong)iVar41;
          goto LAB_0017ab82;
        }
        if (*(char *)(lVar26 + uVar8) != '\0') {
          uVar8 = uVar37 & 0xffffffff;
          goto LAB_00179902;
        }
        if (*(char *)(lVar20 + uVar8) == '\0') goto LAB_0017b944;
        if (*(char *)(lVar26 + 3 + lVar33) == '\0') {
          *(uint *)(lVar21 + uVar8 * 4) = uVar6;
          goto LAB_0017b97f;
        }
        uVar23 = (ulong)iVar41;
        goto LAB_00179a42;
      }
      *(undefined4 *)(lVar21 + lVar33 * 4) = 0;
      uVar8 = lVar33 + 2;
      iVar41 = (int)uVar8;
      if (iVar28 <= iVar41) {
        cVar2 = *(char *)(lVar26 + (uVar8 & 0xffffffff));
        if (iVar41 <= iVar28) {
          if (cVar2 != '\0') goto LAB_0017998d;
          goto LAB_0017945b;
        }
        if (cVar2 != '\0') goto LAB_001799d0;
        goto LAB_001793d8;
      }
      if (*(char *)(lVar26 + uVar8) == '\0') {
LAB_001791ba:
        lVar33 = (long)(int)uVar8;
        if (*(char *)(lVar20 + lVar33) == '\0') goto LAB_00179229;
        if (*(char *)(lVar26 + 1 + lVar33) == '\0') {
          uVar6 = TTA::NewLabel();
          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
          uVar37 = uVar8;
          goto LAB_0017984a;
        }
        uVar9 = uVar8 & 0xffffffff;
        goto LAB_0017923b;
      }
LAB_001794d1:
      iVar41 = (int)uVar8;
      lVar33 = (long)iVar41;
      if (*(char *)(lVar33 + 1 + lVar31) != '\0') {
        if ((*(char *)(lVar31 + lVar33) != '\0') || (*(char *)(lVar31 + -1 + lVar33) == '\0')) {
          *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
          goto LAB_001798bc;
        }
        uVar9 = uVar8 & 0xffffffff;
        goto LAB_0017b53d;
      }
      if (*(char *)(lVar26 + 1 + lVar33) == '\0') {
        lVar33 = (long)iVar41;
        if (*(char *)(lVar31 + lVar33) == '\0') {
          if (*(char *)(lVar31 + -1 + lVar33) == '\0') {
            uVar6 = TTA::NewLabel();
          }
          else {
            uVar6 = *(uint *)(lVar18 + -8 + lVar33 * 4);
          }
          *(uint *)(lVar21 + lVar33 * 4) = uVar6;
          uVar9 = uVar8 & 0xffffffff;
          goto LAB_001795ed;
        }
        *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
        uVar9 = uVar8 & 0xffffffff;
LAB_00179cf3:
        while( true ) {
          lVar33 = (long)(int)uVar9;
          uVar9 = lVar33 + 2;
          iVar41 = (int)uVar9;
          if (iVar28 <= iVar41) {
            uVar23 = uVar9 & 0xffffffff;
            if (iVar28 < iVar41) {
              if (*(char *)(lVar26 + uVar23) == '\0') goto LAB_0017ad2a;
              if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_0017ad18;
            }
            else {
              if (*(char *)(lVar26 + uVar23) == '\0') {
                if (*(char *)(lVar20 + uVar23) == '\0') goto LAB_0017af13;
                if (*(char *)(lVar26 + 3 + lVar33) == '\0') goto LAB_0017af06;
              }
              if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_0017adc1;
              if (*(char *)(lVar31 + 3 + lVar33) != '\0') goto LAB_0017ad8f;
            }
            if (*(char *)(lVar31 + uVar23) == '\0') goto LAB_0017aed9;
            goto LAB_0017aebf;
          }
          if (*(char *)(lVar26 + uVar9) == '\0') break;
          if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_001790f3;
          if (*(char *)(lVar33 + 3 + lVar31) != '\0') goto LAB_0017acbd;
          if (*(char *)(lVar26 + 3 + lVar33) != '\0') goto LAB_00179dbd;
          if (*(char *)(lVar31 + uVar9) == '\0') {
LAB_0017b094:
            *(undefined4 *)(lVar21 + 8 + lVar33 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
LAB_001795ed:
            while( true ) {
              lVar33 = (long)(int)uVar9;
              uVar37 = lVar33 + 2;
              iVar41 = (int)uVar37;
              if (iVar28 <= iVar41) {
                uVar23 = uVar37 & 0xffffffff;
                if (iVar41 <= iVar28) {
                  if (*(char *)(lVar26 + uVar23) == '\0') goto LAB_00179a11;
                  uVar23 = (ulong)iVar41;
                  goto LAB_00179a2f;
                }
                if (*(char *)(lVar26 + uVar23) == '\0') {
                  uVar9 = uVar37 & 0xffffffff;
                  goto LAB_0017ad2a;
                }
                if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_0017ad20;
                uVar23 = (ulong)iVar41;
                goto LAB_00179a49;
              }
              uVar9 = uVar37;
              if (*(char *)(lVar26 + uVar37) == '\0') goto LAB_001796a6;
              if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_001790f3;
              if (*(char *)(lVar33 + 3 + lVar31) != '\0') {
                uVar6 = TTA::Merge(*(uint *)(lVar18 + 8 + lVar33 * 4),*(uint *)(lVar21 + lVar33 * 4)
                                  );
                *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
                uVar9 = uVar37 & 0xffffffff;
                goto LAB_0017b26f;
              }
              uVar9 = uVar37 & 0xffffffff;
              if (*(char *)(lVar26 + 3 + lVar33) != '\0') goto LAB_0017972a;
LAB_00179bae:
              if (*(char *)(lVar31 + uVar37) != '\0') break;
              *(undefined4 *)(lVar21 + uVar37 * 4) = *(undefined4 *)(lVar21 + -8 + uVar37 * 4);
            }
            uVar6 = TTA::Merge(*(uint *)(lVar18 + uVar37 * 4),*(uint *)(lVar21 + -8 + uVar37 * 4));
            *(uint *)(lVar21 + uVar37 * 4) = uVar6;
          }
          else {
LAB_0017b07f:
            uVar6 = *(uint *)(lVar18 + uVar9 * 4);
            if (*(char *)(lVar14 + -1 + uVar9) == '\0') {
              uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + uVar9 * 4));
              *(uint *)(lVar21 + uVar9 * 4) = uVar6;
            }
            else {
              *(uint *)(lVar21 + uVar9 * 4) = uVar6;
            }
          }
        }
        if (*(char *)(lVar20 + uVar9) == '\0') goto LAB_0017ae4d;
        if (*(char *)(lVar33 + 3 + lVar26) == '\0') goto LAB_0017aee6;
        if (*(char *)(lVar20 + 1 + lVar33) == '\0') goto LAB_0017923b;
        if (*(char *)(lVar31 + 3 + lVar33) != '\0') goto LAB_0017ae05;
LAB_00179dbd:
        if (*(char *)(lVar33 + 4 + lVar31) == '\0') {
          if (*(char *)(lVar31 + uVar9) != '\0') goto LAB_0017b0b3;
LAB_0017b0d2:
          uVar6 = (uint)uVar9;
          *(undefined4 *)(lVar21 + 8 + lVar33 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
          goto LAB_00179fc8;
        }
        if (*(char *)(lVar14 + 3 + lVar33) != '\0') goto LAB_0017af74;
        if (*(char *)(lVar31 + uVar9) == '\0') goto LAB_0017b142;
        goto LAB_0017b120;
      }
      uVar37 = (ulong)iVar41;
      if (*(char *)(lVar31 + 2 + uVar37) == '\0') {
        if (*(char *)(lVar31 + uVar37) != '\0') {
          *(undefined4 *)(lVar21 + uVar37 * 4) = *(undefined4 *)(lVar18 + uVar37 * 4);
          goto LAB_0017a371;
        }
        if (*(char *)(lVar31 + -1 + uVar37) == '\0') {
          uVar6 = TTA::NewLabel();
        }
        else {
          uVar6 = *(uint *)(lVar18 + -8 + uVar37 * 4);
        }
        *(uint *)(lVar21 + uVar37 * 4) = uVar6;
        goto LAB_00179e1b;
      }
      if (*(char *)(lVar31 + uVar37) != '\0') goto LAB_00179272;
      if (*(char *)(lVar31 + -1 + uVar37) == '\0') goto LAB_0017ac51;
LAB_0017b79b:
      if ((*(char *)(lVar14 + 1 + uVar37) == '\0') || (*(char *)(lVar14 + uVar37) == '\0')) {
        uVar6 = TTA::Merge(*(uint *)(lVar18 + -8 + uVar37 * 4),*(uint *)(lVar18 + 8 + uVar37 * 4));
      }
      else {
        uVar6 = *(uint *)(lVar18 + 8 + uVar37 * 4);
      }
      *(uint *)(lVar21 + uVar37 * 4) = uVar6;
      goto LAB_00179fd5;
    }
    uVar23 = uVar8 & 0xffffffff;
    if (iVar28 < iVar41) {
      if (*(char *)(lVar26 + uVar23) == '\0') {
        uVar9 = uVar8 & 0xffffffff;
        goto LAB_0017ad2a;
      }
      if (*(char *)(lVar20 + 1 + lVar33) == '\0') {
LAB_001799d0:
        uVar23 = (ulong)iVar41;
        if (*(char *)(lVar31 + uVar23) != '\0') goto LAB_00179138;
        if (*(char *)(lVar31 + -1 + uVar23) == '\0') goto LAB_0017b964;
        *(undefined4 *)(lVar21 + uVar23 * 4) = *(undefined4 *)(lVar18 + -8 + uVar23 * 4);
        goto LAB_0017b97f;
      }
LAB_0017991e:
      uVar23 = (ulong)iVar41;
      if (*(char *)(lVar31 + -1 + uVar23) != '\0') {
        uVar6 = *(uint *)(lVar18 + -8 + uVar23 * 4);
LAB_00179930:
        uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + uVar23 * 4));
        goto LAB_001793e9;
      }
LAB_00179a49:
      if (*(char *)(lVar31 + uVar23) == '\0') {
        uVar11 = *(undefined4 *)(lVar21 + -8 + uVar23 * 4);
        goto LAB_0017ab12;
      }
    }
    else if (*(char *)(lVar26 + uVar23) == '\0') {
      uVar37 = uVar8 & 0xffffffff;
LAB_00179a11:
      iVar41 = (int)uVar37;
      if (*(char *)(lVar20 + uVar23) == '\0') goto LAB_0017b944;
      uVar23 = (ulong)iVar41;
      if (*(char *)(lVar26 + 1 + uVar23) == '\0') goto LAB_0017ad39;
LAB_00179a2f:
      iVar17 = (int)uVar37;
      if (*(char *)(lVar20 + -1 + uVar23) == '\0') goto LAB_00179091;
LAB_00179a42:
      if (*(char *)(lVar31 + 1 + uVar23) == '\0') goto LAB_00179a49;
    }
    else {
      if (*(char *)(lVar20 + 1 + lVar33) == '\0') {
LAB_0017998d:
        iVar41 = (int)uVar8;
        lVar26 = (long)iVar41;
        if (*(char *)(lVar31 + 1 + lVar26) == '\0') goto LAB_001799d0;
        if ((*(char *)(lVar31 + lVar26) != '\0') || (*(char *)(lVar31 + -1 + lVar26) == '\0'))
        goto LAB_0017b863;
        goto LAB_001799b2;
      }
LAB_00179902:
      iVar41 = (int)uVar8;
      uVar23 = (ulong)iVar41;
      if (*(char *)(lVar31 + 1 + uVar23) == '\0') goto LAB_0017991e;
      if (*(char *)(lVar31 + uVar23) != '\0') {
        uVar6 = *(uint *)(lVar18 + uVar23 * 4);
        goto LAB_00179930;
      }
      if (*(char *)(lVar31 + -1 + uVar23) != '\0') {
        if (*(char *)(lVar14 + uVar23) == '\0') {
          uVar6 = TTA::Merge(*(uint *)(lVar18 + -8 + uVar23 * 4),*(uint *)(lVar18 + uVar23 * 4));
          uVar7 = *(uint *)(lVar21 + -8 + uVar23 * 4);
        }
        else {
          uVar6 = *(uint *)(lVar18 + uVar23 * 4);
          uVar7 = *(uint *)(lVar21 + -8 + uVar23 * 4);
        }
        uVar6 = TTA::Merge(uVar6,uVar7);
        *(uint *)(lVar21 + uVar23 * 4) = uVar6;
        goto LAB_0017b97f;
      }
    }
    uVar6 = *(uint *)(lVar18 + uVar23 * 4);
    uVar7 = *(uint *)(lVar21 + -8 + uVar23 * 4);
    goto LAB_00179a57;
  }
  uVar9 = uVar37 & 0xffffffff;
LAB_0017b475:
  uVar8 = uVar9 & 0xffffffff;
  if (*(char *)(lVar31 + 1 + uVar37) != '\0') goto LAB_0017b484;
  goto LAB_0017ac29;
LAB_0017b93f:
  uVar37 = uVar37 & 0xffffffff;
  goto LAB_0017b944;
LAB_0017b851:
  lVar26 = (long)(int)uVar37;
  if (*(char *)(lVar31 + 1 + lVar26) == '\0') {
    uVar11 = *(undefined4 *)(lVar21 + -8 + lVar26 * 4);
  }
  else {
LAB_0017b85c:
    if (*(char *)(lVar31 + lVar26) == '\0') {
      uVar6 = *(uint *)(lVar18 + lVar26 * 4);
      if (*(char *)(lVar14 + lVar26) == '\0') {
        uVar7 = *(uint *)(lVar21 + -8 + lVar26 * 4);
LAB_0017b895:
        uVar6 = TTA::Merge(uVar6,uVar7);
        *(uint *)(lVar21 + lVar26 * 4) = uVar6;
      }
      else {
        *(uint *)(lVar21 + lVar26 * 4) = uVar6;
      }
      goto LAB_0017b97f;
    }
LAB_0017b863:
    uVar11 = *(undefined4 *)(lVar18 + lVar26 * 4);
  }
  *(undefined4 *)(lVar21 + lVar26 * 4) = uVar11;
  goto LAB_0017b97f;
LAB_0017abf9:
  uVar37 = (ulong)(int)uVar8;
  if (*(char *)(uVar37 + 1 + lVar31) != '\0') {
    uVar9 = uVar8 & 0xffffffff;
    goto LAB_0017ac07;
  }
  if (*(char *)(lVar26 + 1 + uVar37) == '\0') {
    uVar6 = *(uint *)(lVar21 + -8 + uVar37 * 4);
LAB_0017ac7b:
    *(uint *)(lVar21 + uVar37 * 4) = uVar6;
    goto LAB_0017ac89;
  }
LAB_0017ac29:
  if (*(char *)(lVar31 + 2 + uVar37) != '\0') goto LAB_0017ac35;
  *(undefined4 *)(lVar21 + uVar37 * 4) = *(undefined4 *)(lVar21 + -8 + uVar37 * 4);
  goto LAB_0017a579;
LAB_0017ae4d:
  uVar8 = uVar9 & 0xffffffff;
  goto LAB_00179229;
LAB_0017aee6:
  uVar9 = uVar9 & 0xffffffff;
LAB_00179813:
  uVar37 = uVar9;
  lVar33 = (long)(int)uVar37;
  if (*(char *)(lVar20 + -1 + lVar33) == '\0') {
    uVar6 = TTA::NewLabel();
  }
  else {
    uVar6 = *(uint *)(lVar21 + -8 + lVar33 * 4);
  }
  *(uint *)(lVar21 + lVar33 * 4) = uVar6;
  goto LAB_0017984a;
LAB_0017ae05:
  if (*(char *)(lVar14 + -1 + uVar9) == '\0') {
    uVar6 = TTA::Merge(*(uint *)(lVar18 + uVar9 * 4),*(uint *)(lVar21 + -8 + uVar9 * 4));
    *(uint *)(lVar21 + uVar9 * 4) = uVar6;
  }
  else {
LAB_0017b484:
    lVar33 = (long)(int)uVar9;
    if (*(char *)(lVar31 + lVar33) == '\0') {
      uVar6 = *(uint *)(lVar18 + lVar33 * 4);
      if (*(char *)(lVar14 + lVar33) == '\0') {
        uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + lVar33 * 4));
        *(uint *)(lVar21 + lVar33 * 4) = uVar6;
      }
      else {
        *(uint *)(lVar21 + lVar33 * 4) = uVar6;
      }
    }
    else {
      *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
    }
  }
  goto LAB_0017ab1b;
LAB_001796a6:
  uVar37 = (ulong)(int)uVar9;
  uVar8 = uVar9;
  if (*(char *)(lVar20 + uVar37) != '\0') {
    if (*(char *)(lVar26 + 1 + uVar37) == '\0') goto LAB_00179813;
    if (*(char *)(lVar20 + -1 + uVar37) != '\0') {
LAB_001796cf:
      if (*(char *)(lVar31 + 1 + uVar37) != '\0') {
        uVar6 = TTA::Merge(*(uint *)(lVar18 + uVar37 * 4),*(uint *)(lVar21 + -8 + uVar37 * 4));
        *(uint *)(lVar21 + uVar37 * 4) = uVar6;
        goto LAB_0017ab1b;
      }
      uVar37 = uVar9 & 0xffffffff;
LAB_0017972a:
      lVar33 = (long)(int)uVar37;
      if (*(char *)(lVar33 + 2 + lVar31) == '\0') {
        uVar8 = uVar37 & 0xffffffff;
        goto LAB_00179782;
      }
      if (*(char *)(lVar14 + 1 + lVar33) == '\0') {
        if (*(char *)(lVar31 + lVar33) == '\0') {
          uVar7 = *(uint *)(lVar18 + 8 + lVar33 * 4);
          uVar6 = *(uint *)(lVar21 + -8 + lVar33 * 4);
        }
        else {
          uVar7 = TTA::Merge(*(uint *)(lVar18 + lVar33 * 4),*(uint *)(lVar18 + 8 + lVar33 * 4));
          uVar6 = *(uint *)(lVar21 + -8 + lVar33 * 4);
        }
        uVar6 = TTA::Merge(uVar7,uVar6);
        *(uint *)(lVar21 + lVar33 * 4) = uVar6;
        uVar8 = uVar37 & 0xffffffff;
      }
      else {
        uVar6 = TTA::Merge(*(uint *)(lVar18 + 8 + lVar33 * 4),*(uint *)(lVar21 + -8 + lVar33 * 4));
        *(uint *)(lVar21 + lVar33 * 4) = uVar6;
        uVar8 = uVar37 & 0xffffffff;
      }
      goto LAB_00179fd5;
    }
    goto LAB_0017923b;
  }
LAB_00179229:
  uVar9 = uVar8 & 0xffffffff;
  if (*(char *)(lVar26 + 1 + (long)(int)uVar8) != '\0') goto LAB_0017923b;
  goto LAB_001792ef;
LAB_0017923b:
  lVar33 = (long)(int)uVar9;
  if (*(char *)(lVar31 + 1 + lVar33) != '\0') {
    *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
    goto LAB_0017ab1b;
  }
LAB_00179261:
  uVar8 = uVar9 & 0xffffffff;
  lVar33 = (long)(int)uVar9;
  if (*(char *)(lVar31 + 2 + lVar33) != '\0') {
    if (*(char *)(lVar31 + lVar33) == '\0') goto LAB_00179281;
    goto LAB_00179272;
  }
  if (*(char *)(lVar31 + lVar33) != '\0') {
    *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
    goto LAB_0017a371;
  }
  uVar6 = TTA::NewLabel();
  *(uint *)(lVar21 + lVar33 * 4) = uVar6;
  goto LAB_00179e1b;
code_r0x00179eb1:
  if (*(char *)(lVar33 + 3 + lVar26) == '\0') goto LAB_0017a4a4;
  if (*(char *)(lVar31 + 3 + lVar33) == '\0') goto LAB_00179efd;
LAB_00179ec9:
  uVar6 = TTA::Merge(*(uint *)(lVar18 + 8 + lVar33 * 4),*(uint *)(lVar21 + lVar33 * 4));
  *(uint *)(lVar21 + 8 + lVar33 * 4) = uVar6;
  goto LAB_0017ab1b;
LAB_0017a4a4:
  *(undefined4 *)(lVar21 + 8 + lVar33 * 4) = *(undefined4 *)(lVar21 + lVar33 * 4);
  uVar37 = uVar9 & 0xffffffff;
  goto LAB_0017984a;
LAB_0017ac35:
  if (*(char *)(lVar14 + 1 + uVar37) == '\0') {
LAB_0017af8a:
    uVar6 = TTA::Merge(*(uint *)(lVar18 + 8 + uVar37 * 4),*(uint *)(lVar21 + -8 + uVar37 * 4));
  }
  else {
LAB_0017ac46:
    if (*(char *)(lVar31 + uVar37) == '\0') {
      uVar6 = *(uint *)(lVar18 + 8 + uVar37 * 4);
      if (*(char *)(lVar14 + uVar37) == '\0') {
        uVar6 = TTA::Merge(uVar6,*(uint *)(lVar21 + -8 + uVar37 * 4));
        *(uint *)(lVar21 + uVar37 * 4) = uVar6;
      }
      else {
        *(uint *)(lVar21 + uVar37 * 4) = uVar6;
      }
      goto LAB_00179fd5;
    }
LAB_0017ac51:
    uVar6 = *(uint *)(lVar18 + 8 + uVar37 * 4);
  }
  *(uint *)(lVar21 + uVar37 * 4) = uVar6;
  goto LAB_00179fd5;
code_r0x0017a627:
  *(undefined4 *)(lVar34 + lVar15 * 4) = *(undefined4 *)(lVar38 + lVar16 + lVar15 * 4);
  lVar32 = lVar32 + 0x200000000;
  lVar15 = lVar15 + 2;
  goto LAB_0017a5d8;
LAB_0017b512:
  uVar9 = (ulong)(iVar41 + iVar40 + 2);
  lVar33 = lVar42 + 0x200000000 >> 0x20;
LAB_0017b53d:
  if (*(char *)(lVar14 + lVar33) == '\0') {
    uVar6 = TTA::Merge(*(uint *)(lVar18 + -8 + lVar33 * 4),*(uint *)(lVar18 + lVar33 * 4));
    *(uint *)(lVar21 + lVar33 * 4) = uVar6;
  }
  else {
    *(undefined4 *)(lVar21 + lVar33 * 4) = *(undefined4 *)(lVar18 + lVar33 * 4);
  }
  goto LAB_0017b26f;
LAB_00178bc2:
  uVar11 = *(undefined4 *)(lVar36 + uVar9 * 4);
  uVar8 = uVar37 & 0xffffffff;
LAB_00178bc9:
  *(undefined4 *)(lVar36 + uVar37 * 4) = uVar11;
  goto LAB_00178b49;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}